

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  RTCRayQueryContext *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  int iVar70;
  uint uVar71;
  uint uVar72;
  long lVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  undefined4 uVar77;
  undefined8 unaff_R13;
  ulong uVar78;
  bool bVar79;
  float fVar80;
  float fVar82;
  float fVar114;
  float fVar116;
  vint4 bi_2;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar98 [32];
  float fVar81;
  undefined1 auVar99 [32];
  float fVar115;
  float fVar117;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar87 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar128 [32];
  undefined1 auVar137 [64];
  float fVar138;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar180;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar196;
  float fVar197;
  vint4 ai;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar182 [16];
  float fVar198;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  vint4 ai_1;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar227;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar233;
  float fVar244;
  float fVar245;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar252;
  float fVar254;
  float fVar255;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar249;
  float fVar251;
  float fVar253;
  undefined1 auVar243 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar263;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [28];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_cc4;
  uint uStack_c04;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  RTCFilterFunctionNArguments local_bb0;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 auStack_b10 [16];
  undefined1 (*local_ae8) [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  Primitive *local_a08;
  ulong local_a00;
  undefined1 auStack_9f8 [24];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint uStack_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  uint local_740;
  uint uStack_73c;
  uint uStack_738;
  uint uStack_734;
  uint uStack_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar262 [64];
  undefined1 auVar267 [64];
  undefined1 auVar270 [64];
  
  PVar1 = prim[1];
  uVar78 = (ulong)(byte)PVar1;
  fVar80 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar6 = vsubps_avx(auVar6,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  auVar83._0_4_ = fVar80 * auVar6._0_4_;
  auVar83._4_4_ = fVar80 * auVar6._4_4_;
  auVar83._8_4_ = fVar80 * auVar6._8_4_;
  auVar83._12_4_ = fVar80 * auVar6._12_4_;
  auVar199._0_4_ = fVar80 * auVar7._0_4_;
  auVar199._4_4_ = fVar80 * auVar7._4_4_;
  auVar199._8_4_ = fVar80 * auVar7._8_4_;
  auVar199._12_4_ = fVar80 * auVar7._12_4_;
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar236 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xc + 6)));
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xd + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x12 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x13 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x14 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar275._4_4_ = auVar199._0_4_;
  auVar275._0_4_ = auVar199._0_4_;
  auVar275._8_4_ = auVar199._0_4_;
  auVar275._12_4_ = auVar199._0_4_;
  auVar122 = vshufps_avx(auVar199,auVar199,0x55);
  auVar84 = vshufps_avx(auVar199,auVar199,0xaa);
  fVar80 = auVar84._0_4_;
  auVar256._0_4_ = fVar80 * auVar9._0_4_;
  fVar114 = auVar84._4_4_;
  auVar256._4_4_ = fVar114 * auVar9._4_4_;
  fVar181 = auVar84._8_4_;
  auVar256._8_4_ = fVar181 * auVar9._8_4_;
  fVar196 = auVar84._12_4_;
  auVar256._12_4_ = fVar196 * auVar9._12_4_;
  auVar234._0_4_ = auVar11._0_4_ * fVar80;
  auVar234._4_4_ = auVar11._4_4_ * fVar114;
  auVar234._8_4_ = auVar11._8_4_ * fVar181;
  auVar234._12_4_ = auVar11._12_4_ * fVar196;
  auVar218._0_4_ = auVar89._0_4_ * fVar80;
  auVar218._4_4_ = auVar89._4_4_ * fVar114;
  auVar218._8_4_ = auVar89._8_4_ * fVar181;
  auVar218._12_4_ = auVar89._12_4_ * fVar196;
  auVar84 = vfmadd231ps_fma(auVar256,auVar122,auVar7);
  auVar123 = vfmadd231ps_fma(auVar234,auVar122,auVar236);
  auVar122 = vfmadd231ps_fma(auVar218,auVar85,auVar122);
  auVar158 = vfmadd231ps_fma(auVar84,auVar275,auVar6);
  auVar123 = vfmadd231ps_fma(auVar123,auVar275,auVar10);
  auVar142 = vfmadd231ps_fma(auVar122,auVar86,auVar275);
  auVar276._4_4_ = auVar83._0_4_;
  auVar276._0_4_ = auVar83._0_4_;
  auVar276._8_4_ = auVar83._0_4_;
  auVar276._12_4_ = auVar83._0_4_;
  auVar122 = vshufps_avx(auVar83,auVar83,0x55);
  auVar84 = vshufps_avx(auVar83,auVar83,0xaa);
  fVar80 = auVar84._0_4_;
  auVar200._0_4_ = fVar80 * auVar9._0_4_;
  fVar114 = auVar84._4_4_;
  auVar200._4_4_ = fVar114 * auVar9._4_4_;
  fVar181 = auVar84._8_4_;
  auVar200._8_4_ = fVar181 * auVar9._8_4_;
  fVar196 = auVar84._12_4_;
  auVar200._12_4_ = fVar196 * auVar9._12_4_;
  auVar121._0_4_ = auVar11._0_4_ * fVar80;
  auVar121._4_4_ = auVar11._4_4_ * fVar114;
  auVar121._8_4_ = auVar11._8_4_ * fVar181;
  auVar121._12_4_ = auVar11._12_4_ * fVar196;
  auVar84._0_4_ = auVar89._0_4_ * fVar80;
  auVar84._4_4_ = auVar89._4_4_ * fVar114;
  auVar84._8_4_ = auVar89._8_4_ * fVar181;
  auVar84._12_4_ = auVar89._12_4_ * fVar196;
  auVar7 = vfmadd231ps_fma(auVar200,auVar122,auVar7);
  auVar9 = vfmadd231ps_fma(auVar121,auVar122,auVar236);
  auVar236 = vfmadd231ps_fma(auVar84,auVar122,auVar85);
  auVar11 = vfmadd231ps_fma(auVar7,auVar276,auVar6);
  auVar85 = vfmadd231ps_fma(auVar9,auVar276,auVar10);
  auVar228._8_4_ = 0x7fffffff;
  auVar228._0_8_ = 0x7fffffff7fffffff;
  auVar228._12_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(auVar236,auVar276,auVar86);
  auVar6 = vandps_avx(auVar158,auVar228);
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  auVar6 = vcmpps_avx(auVar6,auVar182,1);
  auVar7 = vblendvps_avx(auVar158,auVar182,auVar6);
  auVar6 = vandps_avx(auVar123,auVar228);
  auVar6 = vcmpps_avx(auVar6,auVar182,1);
  auVar9 = vblendvps_avx(auVar123,auVar182,auVar6);
  auVar6 = vandps_avx(auVar228,auVar142);
  auVar6 = vcmpps_avx(auVar6,auVar182,1);
  auVar6 = vblendvps_avx(auVar142,auVar182,auVar6);
  auVar10 = vrcpps_avx(auVar7);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar10,auVar219);
  auVar10 = vfmadd132ps_fma(auVar7,auVar10,auVar10);
  auVar7 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar7,auVar219);
  auVar236 = vfmadd132ps_fma(auVar9,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar7,auVar219);
  auVar86 = vfmadd132ps_fma(auVar6,auVar7,auVar7);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar9 = vsubps_avx(auVar6,auVar11);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar142._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar142._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar142._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar142._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar11);
  auVar201._0_4_ = auVar10._0_4_ * auVar6._0_4_;
  auVar201._4_4_ = auVar10._4_4_ * auVar6._4_4_;
  auVar201._8_4_ = auVar10._8_4_ * auVar6._8_4_;
  auVar201._12_4_ = auVar10._12_4_ * auVar6._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0xe + 6);
  auVar6 = vpmovsxwd_avx(auVar9);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vsubps_avx(auVar6,auVar85);
  auVar123._1_3_ = 0;
  auVar123[0] = PVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar10);
  auVar211._0_4_ = auVar236._0_4_ * auVar7._0_4_;
  auVar211._4_4_ = auVar236._4_4_ * auVar7._4_4_;
  auVar211._8_4_ = auVar236._8_4_ * auVar7._8_4_;
  auVar211._12_4_ = auVar236._12_4_ * auVar7._12_4_;
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar85);
  auVar122._0_4_ = auVar236._0_4_ * auVar6._0_4_;
  auVar122._4_4_ = auVar236._4_4_ * auVar6._4_4_;
  auVar122._8_4_ = auVar236._8_4_ * auVar6._8_4_;
  auVar122._12_4_ = auVar236._12_4_ * auVar6._12_4_;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar78 * 0x15 + 6);
  auVar6 = vpmovsxwd_avx(auVar236);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar89);
  auVar158._0_4_ = auVar86._0_4_ * auVar6._0_4_;
  auVar158._4_4_ = auVar86._4_4_ * auVar6._4_4_;
  auVar158._8_4_ = auVar86._8_4_ * auVar6._8_4_;
  auVar158._12_4_ = auVar86._12_4_ * auVar6._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 * 0x17 + 6);
  auVar6 = vpmovsxwd_avx(auVar11);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar89);
  auVar85._0_4_ = auVar86._0_4_ * auVar6._0_4_;
  auVar85._4_4_ = auVar86._4_4_ * auVar6._4_4_;
  auVar85._8_4_ = auVar86._8_4_ * auVar6._8_4_;
  auVar85._12_4_ = auVar86._12_4_ * auVar6._12_4_;
  auVar6 = vpminsd_avx(auVar142,auVar201);
  auVar7 = vpminsd_avx(auVar211,auVar122);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  auVar7 = vpminsd_avx(auVar158,auVar85);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar235._4_4_ = uVar77;
  auVar235._0_4_ = uVar77;
  auVar235._8_4_ = uVar77;
  auVar235._12_4_ = uVar77;
  auVar7 = vmaxps_avx(auVar7,auVar235);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  local_7a0._0_4_ = auVar6._0_4_ * 0.99999964;
  local_7a0._4_4_ = auVar6._4_4_ * 0.99999964;
  local_7a0._8_4_ = auVar6._8_4_ * 0.99999964;
  local_7a0._12_4_ = auVar6._12_4_ * 0.99999964;
  auVar6 = vpmaxsd_avx(auVar142,auVar201);
  auVar7 = vpmaxsd_avx(auVar211,auVar122);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar7 = vpmaxsd_avx(auVar158,auVar85);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar89._4_4_ = uVar77;
  auVar89._0_4_ = uVar77;
  auVar89._8_4_ = uVar77;
  auVar89._12_4_ = uVar77;
  auVar7 = vminps_avx(auVar7,auVar89);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar86._0_4_ = auVar6._0_4_ * 1.0000004;
  auVar86._4_4_ = auVar6._4_4_ * 1.0000004;
  auVar86._8_4_ = auVar6._8_4_ * 1.0000004;
  auVar86._12_4_ = auVar6._12_4_ * 1.0000004;
  auVar123[4] = PVar1;
  auVar123._5_3_ = 0;
  auVar123[8] = PVar1;
  auVar123._9_3_ = 0;
  auVar123[0xc] = PVar1;
  auVar123._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar123,_DAT_01f4ad30);
  auVar6 = vcmpps_avx(local_7a0,auVar86,2);
  auVar6 = vandps_avx(auVar6,auVar7);
  auVar128._16_16_ = mm_lookupmask_ps._240_16_;
  auVar128._0_16_ = mm_lookupmask_ps._240_16_;
  uVar77 = vmovmskps_avx(auVar6);
  uVar78 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar77);
  local_700 = vblendps_avx(auVar128,ZEXT832(0) << 0x20,0x80);
  local_ae8 = (undefined1 (*) [32])&local_420;
  iVar70 = 1 << ((uint)k & 0x1f);
  auVar98._4_4_ = iVar70;
  auVar98._0_4_ = iVar70;
  auVar98._8_4_ = iVar70;
  auVar98._12_4_ = iVar70;
  auVar98._16_4_ = iVar70;
  auVar98._20_4_ = iVar70;
  auVar98._24_4_ = iVar70;
  auVar98._28_4_ = iVar70;
  auVar128 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar98 = vpand_avx2(auVar98,auVar128);
  local_780 = vpcmpeqd_avx2(auVar98,auVar128);
  local_a08 = prim;
LAB_011b567b:
  if (uVar78 == 0) {
    return;
  }
  lVar73 = 0;
  for (uVar75 = uVar78; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar73 = lVar73 + 1;
  }
  uVar72 = *(uint *)(local_a08 + 2);
  local_760 = *(uint *)(local_a08 + lVar73 * 4 + 6);
  local_a00 = (ulong)local_760;
  pGVar3 = (context->scene->geometries).items[uVar72].ptr;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_a00);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar73 = *(long *)&pGVar3[1].time_range.upper;
  auVar6 = *(undefined1 (*) [16])(lVar73 + (long)p_Var4 * uVar75);
  auVar7 = *(undefined1 (*) [16])(lVar73 + (uVar75 + 1) * (long)p_Var4);
  auVar9 = *(undefined1 (*) [16])(lVar73 + (uVar75 + 2) * (long)p_Var4);
  uVar78 = uVar78 - 1 & uVar78;
  auVar10 = *(undefined1 (*) [16])(lVar73 + (uVar75 + 3) * (long)p_Var4);
  if (uVar78 != 0) {
    uVar76 = uVar78 - 1 & uVar78;
    for (uVar75 = uVar78; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar236 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar11 = vinsertps_avx(auVar236,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar257._4_4_ = uVar77;
  auVar257._0_4_ = uVar77;
  auVar257._8_4_ = uVar77;
  auVar257._12_4_ = uVar77;
  fStack_970 = (float)uVar77;
  _local_980 = auVar257;
  fStack_96c = (float)uVar77;
  fStack_968 = (float)uVar77;
  register0x0000149c = uVar77;
  auVar262 = ZEXT3264(_local_980);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar264._4_4_ = uVar77;
  auVar264._0_4_ = uVar77;
  auVar264._8_4_ = uVar77;
  auVar264._12_4_ = uVar77;
  fStack_850 = (float)uVar77;
  _local_860 = auVar264;
  fStack_84c = (float)uVar77;
  fStack_848 = (float)uVar77;
  uStack_844 = uVar77;
  auVar267 = ZEXT3264(_local_860);
  auVar236 = vunpcklps_avx(auVar257,auVar264);
  fVar80 = *(float *)(ray + k * 4 + 0xc0);
  auVar268._4_4_ = fVar80;
  auVar268._0_4_ = fVar80;
  auVar268._8_4_ = fVar80;
  auVar268._12_4_ = fVar80;
  fStack_950 = fVar80;
  _local_960 = auVar268;
  fStack_94c = fVar80;
  fStack_948 = fVar80;
  register0x0000151c = fVar80;
  auVar270 = ZEXT3264(_local_960);
  local_a90 = vinsertps_avx(auVar236,auVar268,0x28);
  auVar202._0_4_ = (auVar6._0_4_ + auVar7._0_4_ + auVar9._0_4_ + auVar10._0_4_) * 0.25;
  auVar202._4_4_ = (auVar6._4_4_ + auVar7._4_4_ + auVar9._4_4_ + auVar10._4_4_) * 0.25;
  auVar202._8_4_ = (auVar6._8_4_ + auVar7._8_4_ + auVar9._8_4_ + auVar10._8_4_) * 0.25;
  auVar202._12_4_ = (auVar6._12_4_ + auVar7._12_4_ + auVar9._12_4_ + auVar10._12_4_) * 0.25;
  auVar236 = vsubps_avx(auVar202,auVar11);
  auVar236 = vdpps_avx(auVar236,local_a90,0x7f);
  local_aa0 = vdpps_avx(local_a90,local_a90,0x7f);
  auVar243 = ZEXT1664(local_aa0);
  auVar86 = vrcpss_avx(local_aa0,local_aa0);
  auVar85 = vfnmadd213ss_fma(auVar86,local_aa0,ZEXT416(0x40000000));
  local_320 = auVar236._0_4_ * auVar86._0_4_ * auVar85._0_4_;
  auVar212._4_4_ = local_320;
  auVar212._0_4_ = local_320;
  auVar212._8_4_ = local_320;
  auVar212._12_4_ = local_320;
  fStack_a50 = local_320;
  _local_a60 = auVar212;
  fStack_a4c = local_320;
  fStack_a48 = local_320;
  fStack_a44 = local_320;
  auVar236 = vfmadd231ps_fma(auVar11,local_a90,auVar212);
  auVar236 = vblendps_avx(auVar236,_DAT_01f45a50,8);
  auVar11 = vsubps_avx(auVar6,auVar236);
  auVar9 = vsubps_avx(auVar9,auVar236);
  auVar86 = vsubps_avx(auVar7,auVar236);
  auVar10 = vsubps_avx(auVar10,auVar236);
  auVar6 = vmovshdup_avx(auVar11);
  local_5a0 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar11,auVar11,0xaa);
  local_1e0 = auVar6._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar6 = vshufps_avx(auVar11,auVar11,0xff);
  local_5c0 = auVar6._0_8_;
  auVar6 = vmovshdup_avx(auVar86);
  local_5e0 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar86,auVar86,0xaa);
  local_600 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar86,auVar86,0xff);
  local_620 = auVar6._0_8_;
  auVar6 = vmovshdup_avx(auVar9);
  local_640 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar9,auVar9,0xaa);
  local_660 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar9,auVar9,0xff);
  local_680 = auVar6._0_8_;
  auVar6 = vmovshdup_avx(auVar10);
  local_6a0 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar10,auVar10,0xaa);
  local_6c0 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar10,auVar10,0xff);
  local_200 = auVar6._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar6 = vfmadd231ps_fma(ZEXT432((uint)(fVar80 * fVar80)),_local_860,_local_860);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_980,_local_980);
  uVar77 = auVar6._0_4_;
  local_220._4_4_ = uVar77;
  local_220._0_4_ = uVar77;
  local_220._8_4_ = uVar77;
  local_220._12_4_ = uVar77;
  local_220._16_4_ = uVar77;
  local_220._20_4_ = uVar77;
  local_220._24_4_ = uVar77;
  local_220._28_4_ = uVar77;
  auVar226 = ZEXT3264(local_220);
  fVar80 = *(float *)(ray + k * 4 + 0x60);
  local_a20 = ZEXT416((uint)local_320);
  local_320 = fVar80 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  uVar75 = 0;
  local_cc4 = 1;
  local_6e0 = auVar11._0_4_;
  local_240 = auVar86._0_4_;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  local_2e0._0_4_ = auVar9._0_4_;
  local_2e0._4_4_ = local_2e0._0_4_;
  local_2e0._8_4_ = local_2e0._0_4_;
  local_2e0._12_4_ = local_2e0._0_4_;
  local_2e0._16_4_ = local_2e0._0_4_;
  local_2e0._20_4_ = local_2e0._0_4_;
  local_2e0._24_4_ = local_2e0._0_4_;
  local_2e0._28_4_ = local_2e0._0_4_;
  fVar114 = auVar10._0_4_;
  local_300._4_4_ = fVar114;
  local_300._0_4_ = fVar114;
  local_300._8_4_ = fVar114;
  local_300._12_4_ = fVar114;
  local_300._16_4_ = fVar114;
  local_300._20_4_ = fVar114;
  local_300._24_4_ = fVar114;
  local_300._28_4_ = fVar114;
  auVar210 = ZEXT3264(local_300);
  local_880._8_4_ = 0x7fffffff;
  local_880._0_8_ = 0x7fffffff7fffffff;
  local_880._12_4_ = 0x7fffffff;
  local_880._16_4_ = 0x7fffffff;
  local_880._20_4_ = 0x7fffffff;
  local_880._24_4_ = 0x7fffffff;
  local_880._28_4_ = 0x7fffffff;
  local_720 = vandps_avx(local_220,local_880);
  auVar6 = vsqrtss_avx(local_aa0,local_aa0);
  auVar7 = vsqrtss_avx(local_aa0,local_aa0);
  auVar137 = ZEXT1664(ZEXT816(0x3f80000000000000));
  uStack_75c = local_760;
  uStack_758 = local_760;
  uStack_754 = local_760;
  uStack_750 = local_760;
  uStack_74c = local_760;
  uStack_748 = local_760;
  uStack_744 = local_760;
  local_740 = uVar72;
  uStack_73c = uVar72;
  uStack_738 = uVar72;
  uStack_734 = uVar72;
  uStack_730 = uVar72;
  uStack_72c = uVar72;
  uStack_728 = uVar72;
  uStack_724 = uVar72;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6d0 = local_6e0;
  uStack_6cc = local_6e0;
  uStack_6c8 = local_6e0;
  uStack_6c4 = local_6e0;
  uStack_6b8 = local_6c0;
  uStack_6b0 = local_6c0;
  uStack_6a8 = local_6c0;
  uStack_698 = local_6a0;
  uStack_690 = local_6a0;
  uStack_688 = local_6a0;
  uStack_678 = local_680;
  uStack_670 = local_680;
  uStack_668 = local_680;
  uStack_658 = local_660;
  uStack_650 = local_660;
  uStack_648 = local_660;
  uStack_638 = local_640;
  uStack_630 = local_640;
  uStack_628 = local_640;
  uStack_618 = local_620;
  uStack_610 = local_620;
  uStack_608 = local_620;
  uStack_5f8 = local_600;
  uStack_5f0 = local_600;
  uStack_5e8 = local_600;
  uStack_5d8 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  do {
    local_790 = auVar137._0_16_;
    auVar236 = vmovshdup_avx(local_790);
    auVar236 = vsubps_avx(auVar236,local_790);
    local_900._0_4_ = auVar236._0_4_;
    fVar255 = (float)local_900._0_4_ * 0.04761905;
    uVar77 = auVar137._0_4_;
    local_8e0._4_4_ = uVar77;
    local_8e0._0_4_ = uVar77;
    local_8e0._8_4_ = uVar77;
    local_8e0._12_4_ = uVar77;
    local_8e0._16_4_ = uVar77;
    local_8e0._20_4_ = uVar77;
    local_8e0._24_4_ = uVar77;
    local_8e0._28_4_ = uVar77;
    local_900._4_4_ = local_900._0_4_;
    local_900._8_4_ = local_900._0_4_;
    local_900._12_4_ = local_900._0_4_;
    local_900._16_4_ = local_900._0_4_;
    local_900._20_4_ = local_900._0_4_;
    local_900._24_4_ = local_900._0_4_;
    local_900._28_4_ = local_900._0_4_;
    auVar236 = vfmadd231ps_fma(local_8e0,local_900,_DAT_01f7b040);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar98 = vsubps_avx(auVar99,ZEXT1632(auVar236));
    fVar181 = auVar98._0_4_;
    fVar197 = auVar98._4_4_;
    fVar82 = auVar98._8_4_;
    fVar180 = auVar98._12_4_;
    fVar250 = auVar98._16_4_;
    fVar252 = auVar98._20_4_;
    fVar254 = auVar98._24_4_;
    fVar81 = fVar181 * fVar181 * fVar181;
    fVar115 = fVar197 * fVar197 * fVar197;
    fVar116 = fVar82 * fVar82 * fVar82;
    fVar117 = fVar180 * fVar180 * fVar180;
    fVar118 = fVar250 * fVar250 * fVar250;
    fVar119 = fVar252 * fVar252 * fVar252;
    fVar120 = fVar254 * fVar254 * fVar254;
    fVar196 = auVar236._0_4_;
    fVar198 = auVar236._4_4_;
    fVar246 = auVar236._8_4_;
    fVar248 = auVar236._12_4_;
    fVar138 = fVar196 * fVar196 * fVar196;
    fVar155 = fVar198 * fVar198 * fVar198;
    fVar156 = fVar246 * fVar246 * fVar246;
    fVar157 = fVar248 * fVar248 * fVar248;
    fVar233 = fVar181 * fVar196;
    fVar244 = fVar197 * fVar198;
    fVar245 = fVar82 * fVar246;
    fVar247 = fVar180 * fVar248;
    fVar249 = fVar250 * 0.0;
    fVar251 = fVar252 * 0.0;
    fVar253 = fVar254 * 0.0;
    fVar263 = auVar262._28_4_ + auVar270._28_4_ + 1.0;
    fVar227 = auVar267._28_4_;
    auVar8._4_4_ = fVar115 * 0.16666667;
    auVar8._0_4_ = fVar81 * 0.16666667;
    auVar8._8_4_ = fVar116 * 0.16666667;
    auVar8._12_4_ = fVar117 * 0.16666667;
    auVar8._16_4_ = fVar118 * 0.16666667;
    auVar8._20_4_ = fVar119 * 0.16666667;
    auVar8._24_4_ = fVar120 * 0.16666667;
    auVar8._28_4_ = fVar263;
    auVar12._4_4_ =
         (fVar197 * fVar244 * 12.0 + fVar244 * fVar198 * 6.0 + fVar155 + fVar115 * 4.0) * 0.16666667
    ;
    auVar12._0_4_ =
         (fVar181 * fVar233 * 12.0 + fVar233 * fVar196 * 6.0 + fVar138 + fVar81 * 4.0) * 0.16666667;
    auVar12._8_4_ =
         (fVar82 * fVar245 * 12.0 + fVar245 * fVar246 * 6.0 + fVar156 + fVar116 * 4.0) * 0.16666667;
    auVar12._12_4_ =
         (fVar180 * fVar247 * 12.0 + fVar247 * fVar248 * 6.0 + fVar157 + fVar117 * 4.0) * 0.16666667
    ;
    auVar12._16_4_ =
         (fVar250 * fVar249 * 12.0 + fVar249 * 0.0 * 6.0 + fVar118 * 4.0 + 0.0) * 0.16666667;
    auVar12._20_4_ =
         (fVar252 * fVar251 * 12.0 + fVar251 * 0.0 * 6.0 + fVar119 * 4.0 + 0.0) * 0.16666667;
    auVar12._24_4_ =
         (fVar254 * fVar253 * 12.0 + fVar253 * 0.0 * 6.0 + fVar120 * 4.0 + 0.0) * 0.16666667;
    auVar12._28_4_ = fVar227;
    auVar282._4_4_ =
         (fVar155 * 4.0 + fVar115 + fVar244 * fVar198 * 12.0 + fVar197 * fVar244 * 6.0) * 0.16666667
    ;
    auVar282._0_4_ =
         (fVar138 * 4.0 + fVar81 + fVar233 * fVar196 * 12.0 + fVar181 * fVar233 * 6.0) * 0.16666667;
    auVar282._8_4_ =
         (fVar156 * 4.0 + fVar116 + fVar245 * fVar246 * 12.0 + fVar82 * fVar245 * 6.0) * 0.16666667;
    auVar282._12_4_ =
         (fVar157 * 4.0 + fVar117 + fVar247 * fVar248 * 12.0 + fVar180 * fVar247 * 6.0) * 0.16666667
    ;
    auVar282._16_4_ = (fVar118 + 0.0 + fVar249 * 0.0 * 12.0 + fVar250 * fVar249 * 6.0) * 0.16666667;
    auVar282._20_4_ = (fVar119 + 0.0 + fVar251 * 0.0 * 12.0 + fVar252 * fVar251 * 6.0) * 0.16666667;
    auVar282._24_4_ = (fVar120 + 0.0 + fVar253 * 0.0 * 12.0 + fVar254 * fVar253 * 6.0) * 0.16666667;
    auVar282._28_4_ = auVar270._28_4_;
    fVar138 = fVar138 * 0.16666667;
    fVar155 = fVar155 * 0.16666667;
    fVar156 = fVar156 * 0.16666667;
    fVar157 = fVar157 * 0.16666667;
    auVar104._4_4_ = local_300._4_4_ * fVar155;
    auVar104._0_4_ = local_300._0_4_ * fVar138;
    auVar104._8_4_ = local_300._8_4_ * fVar156;
    auVar104._12_4_ = local_300._12_4_ * fVar157;
    auVar104._16_4_ = local_300._16_4_ * 0.0;
    auVar104._20_4_ = local_300._20_4_ * 0.0;
    auVar104._24_4_ = local_300._24_4_ * 0.0;
    auVar104._28_4_ = 0x3f800000;
    auVar13._4_4_ = fVar155 * local_6a0._4_4_;
    auVar13._0_4_ = fVar138 * (float)local_6a0;
    auVar13._8_4_ = fVar156 * (float)uStack_698;
    auVar13._12_4_ = fVar157 * uStack_698._4_4_;
    auVar13._16_4_ = (float)uStack_690 * 0.0;
    auVar13._20_4_ = uStack_690._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_688 * 0.0;
    auVar13._28_4_ = 0x40800000;
    auVar216._4_4_ = fVar155 * local_6c0._4_4_;
    auVar216._0_4_ = fVar138 * (float)local_6c0;
    auVar216._8_4_ = fVar156 * (float)uStack_6b8;
    auVar216._12_4_ = fVar157 * uStack_6b8._4_4_;
    auVar216._16_4_ = (float)uStack_6b0 * 0.0;
    auVar216._20_4_ = uStack_6b0._4_4_ * 0.0;
    auVar216._24_4_ = (float)uStack_6a8 * 0.0;
    auVar216._28_4_ = 0x3e2aaaab;
    auVar14._4_4_ = local_200._4_4_ * fVar155;
    auVar14._0_4_ = (float)local_200 * fVar138;
    auVar14._8_4_ = (float)uStack_1f8 * fVar156;
    auVar14._12_4_ = uStack_1f8._4_4_ * fVar157;
    auVar14._16_4_ = (float)uStack_1f0 * 0.0;
    auVar14._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar14._24_4_ = (float)uStack_1e8 * 0.0;
    auVar14._28_4_ = fVar263 + fVar227 + auVar210._28_4_;
    auVar236 = vfmadd231ps_fma(auVar104,auVar282,local_2e0);
    auVar54._8_8_ = uStack_638;
    auVar54._0_8_ = local_640;
    auVar54._16_8_ = uStack_630;
    auVar54._24_8_ = uStack_628;
    auVar85 = vfmadd231ps_fma(auVar13,auVar282,auVar54);
    auVar52._8_8_ = uStack_658;
    auVar52._0_8_ = local_660;
    auVar52._16_8_ = uStack_650;
    auVar52._24_8_ = uStack_648;
    auVar89 = vfmadd231ps_fma(auVar216,auVar282,auVar52);
    auVar50._8_8_ = uStack_678;
    auVar50._0_8_ = local_680;
    auVar50._16_8_ = uStack_670;
    auVar50._24_8_ = uStack_668;
    auVar122 = vfmadd231ps_fma(auVar14,auVar282,auVar50);
    auVar68._4_4_ = uStack_23c;
    auVar68._0_4_ = local_240;
    auVar68._8_4_ = uStack_238;
    auVar68._12_4_ = uStack_234;
    auVar68._16_4_ = uStack_230;
    auVar68._20_4_ = uStack_22c;
    auVar68._24_4_ = uStack_228;
    auVar68._28_4_ = uStack_224;
    auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar12,auVar68);
    auVar60._8_8_ = uStack_5d8;
    auVar60._0_8_ = local_5e0;
    auVar60._16_8_ = uStack_5d0;
    auVar60._24_8_ = uStack_5c8;
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar12,auVar60);
    auVar58._8_8_ = uStack_5f8;
    auVar58._0_8_ = local_600;
    auVar58._16_8_ = uStack_5f0;
    auVar58._24_8_ = uStack_5e8;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar12,auVar58);
    auVar56._8_8_ = uStack_618;
    auVar56._0_8_ = local_620;
    auVar56._16_8_ = uStack_610;
    auVar56._24_8_ = uStack_608;
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar12,auVar56);
    auVar100._4_4_ = uStack_6dc;
    auVar100._0_4_ = local_6e0;
    auVar100._8_4_ = uStack_6d8;
    auVar100._12_4_ = uStack_6d4;
    auVar100._16_4_ = uStack_6d0;
    auVar100._20_4_ = uStack_6cc;
    auVar100._24_4_ = uStack_6c8;
    auVar100._28_4_ = uStack_6c4;
    auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar8,auVar100);
    auVar100 = ZEXT1632(auVar236);
    auVar64._8_8_ = uStack_598;
    auVar64._0_8_ = local_5a0;
    auVar64._16_8_ = uStack_590;
    auVar64._24_8_ = uStack_588;
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,auVar64);
    auVar69._8_8_ = uStack_1d8;
    auVar69._0_8_ = local_1e0;
    auVar69._16_8_ = uStack_1d0;
    auVar69._24_8_ = uStack_1c8;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar8,auVar69);
    auVar62._8_8_ = uStack_5b8;
    auVar62._0_8_ = local_5c0;
    auVar62._16_8_ = uStack_5b0;
    auVar62._24_8_ = uStack_5a8;
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar8,auVar62);
    auVar213._0_4_ = -fVar196 * fVar196;
    auVar213._4_4_ = -fVar198 * fVar198;
    auVar213._8_4_ = -fVar246 * fVar246;
    auVar213._12_4_ = -fVar248 * fVar248;
    auVar213._16_4_ = 0x80000000;
    auVar213._20_4_ = 0x80000000;
    auVar213._24_4_ = 0x80000000;
    auVar213._28_4_ = 0;
    auVar16._4_4_ = fVar244 * 4.0;
    auVar16._0_4_ = fVar233 * 4.0;
    auVar16._8_4_ = fVar245 * 4.0;
    auVar16._12_4_ = fVar247 * 4.0;
    auVar16._16_4_ = fVar249 * 4.0;
    auVar16._20_4_ = fVar251 * 4.0;
    auVar16._24_4_ = fVar253 * 4.0;
    auVar16._28_4_ = auVar243._28_4_;
    auVar128 = vsubps_avx(auVar213,auVar16);
    auVar150._4_4_ = fVar197 * -fVar197 * 0.5;
    auVar150._0_4_ = fVar181 * -fVar181 * 0.5;
    auVar150._8_4_ = fVar82 * -fVar82 * 0.5;
    auVar150._12_4_ = fVar180 * -fVar180 * 0.5;
    auVar150._16_4_ = fVar250 * -fVar250 * 0.5;
    auVar150._20_4_ = fVar252 * -fVar252 * 0.5;
    auVar150._24_4_ = fVar254 * -fVar254 * 0.5;
    auVar150._28_4_ = auVar98._28_4_;
    auVar225._4_4_ = auVar128._4_4_ * 0.5;
    auVar225._0_4_ = auVar128._0_4_ * 0.5;
    auVar225._8_4_ = auVar128._8_4_ * 0.5;
    auVar225._12_4_ = auVar128._12_4_ * 0.5;
    auVar225._16_4_ = auVar128._16_4_ * 0.5;
    auVar225._20_4_ = auVar128._20_4_ * 0.5;
    auVar225._24_4_ = auVar128._24_4_ * 0.5;
    auVar225._28_4_ = auVar128._28_4_;
    auVar17._4_4_ = (fVar244 * 4.0 + fVar197 * fVar197) * 0.5;
    auVar17._0_4_ = (fVar233 * 4.0 + fVar181 * fVar181) * 0.5;
    auVar17._8_4_ = (fVar245 * 4.0 + fVar82 * fVar82) * 0.5;
    auVar17._12_4_ = (fVar247 * 4.0 + fVar180 * fVar180) * 0.5;
    auVar17._16_4_ = (fVar249 * 4.0 + fVar250 * fVar250) * 0.5;
    auVar17._20_4_ = (fVar251 * 4.0 + fVar252 * fVar252) * 0.5;
    auVar17._24_4_ = (fVar253 * 4.0 + fVar254 * fVar254) * 0.5;
    auVar17._28_4_ = auVar243._28_4_ + auVar226._28_4_;
    fVar181 = fVar196 * fVar196 * 0.5;
    fVar196 = fVar198 * fVar198 * 0.5;
    fVar197 = fVar246 * fVar246 * 0.5;
    fVar198 = fVar248 * fVar248 * 0.5;
    auVar18._4_4_ = local_300._4_4_ * fVar196;
    auVar18._0_4_ = local_300._0_4_ * fVar181;
    auVar18._8_4_ = local_300._8_4_ * fVar197;
    auVar18._12_4_ = local_300._12_4_ * fVar198;
    auVar18._16_4_ = local_300._16_4_ * 0.0;
    auVar18._20_4_ = local_300._20_4_ * 0.0;
    auVar18._24_4_ = local_300._24_4_ * 0.0;
    auVar18._28_4_ = 0x3f000000;
    auVar193._4_4_ = fVar196 * local_6a0._4_4_;
    auVar193._0_4_ = fVar181 * (float)local_6a0;
    auVar193._8_4_ = fVar197 * (float)uStack_698;
    auVar193._12_4_ = fVar198 * uStack_698._4_4_;
    auVar193._16_4_ = (float)uStack_690 * 0.0;
    auVar193._20_4_ = uStack_690._4_4_ * 0.0;
    auVar193._24_4_ = (float)uStack_688 * 0.0;
    auVar193._28_4_ = 0x80000000;
    auVar271._4_4_ = fVar196 * local_6c0._4_4_;
    auVar271._0_4_ = fVar181 * (float)local_6c0;
    auVar271._8_4_ = fVar197 * (float)uStack_6b8;
    auVar271._12_4_ = fVar198 * uStack_6b8._4_4_;
    auVar271._16_4_ = (float)uStack_6b0 * 0.0;
    auVar271._20_4_ = uStack_6b0._4_4_ * 0.0;
    auVar271._24_4_ = (float)uStack_6a8 * 0.0;
    auVar271._28_4_ = fVar227;
    auVar278._4_4_ = local_200._4_4_ * fVar196;
    auVar278._0_4_ = (float)local_200 * fVar181;
    auVar278._8_4_ = (float)uStack_1f8 * fVar197;
    auVar278._12_4_ = uStack_1f8._4_4_ * fVar198;
    auVar278._16_4_ = (float)uStack_1f0 * 0.0;
    auVar278._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar278._24_4_ = (float)uStack_1e8 * 0.0;
    auVar278._28_4_ = local_300._28_4_;
    auVar236 = vfmadd231ps_fma(auVar18,auVar17,local_2e0);
    auVar55._8_8_ = uStack_638;
    auVar55._0_8_ = local_640;
    auVar55._16_8_ = uStack_630;
    auVar55._24_8_ = uStack_628;
    auVar84 = vfmadd231ps_fma(auVar193,auVar17,auVar55);
    auVar53._8_8_ = uStack_658;
    auVar53._0_8_ = local_660;
    auVar53._16_8_ = uStack_650;
    auVar53._24_8_ = uStack_648;
    auVar123 = vfmadd231ps_fma(auVar271,auVar17,auVar53);
    auVar51._8_8_ = uStack_678;
    auVar51._0_8_ = local_680;
    auVar51._16_8_ = uStack_670;
    auVar51._24_8_ = uStack_668;
    auVar158 = vfmadd231ps_fma(auVar278,auVar17,auVar51);
    auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar225,auVar68);
    auVar61._8_8_ = uStack_5d8;
    auVar61._0_8_ = local_5e0;
    auVar61._16_8_ = uStack_5d0;
    auVar61._24_8_ = uStack_5c8;
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar225,auVar61);
    auVar59._8_8_ = uStack_5f8;
    auVar59._0_8_ = local_600;
    auVar59._16_8_ = uStack_5f0;
    auVar59._24_8_ = uStack_5e8;
    auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar225,auVar59);
    auVar57._8_8_ = uStack_618;
    auVar57._0_8_ = local_620;
    auVar57._16_8_ = uStack_610;
    auVar57._24_8_ = uStack_608;
    auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar225,auVar57);
    auVar49._4_4_ = uStack_6dc;
    auVar49._0_4_ = local_6e0;
    auVar49._8_4_ = uStack_6d8;
    auVar49._12_4_ = uStack_6d4;
    auVar49._16_4_ = uStack_6d0;
    auVar49._20_4_ = uStack_6cc;
    auVar49._24_4_ = uStack_6c8;
    auVar49._28_4_ = uStack_6c4;
    auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar150,auVar49);
    auVar65._8_8_ = uStack_598;
    auVar65._0_8_ = local_5a0;
    auVar65._16_8_ = uStack_590;
    auVar65._24_8_ = uStack_588;
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar150,auVar65);
    auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar150,auVar69);
    auVar63._8_8_ = uStack_5b8;
    auVar63._0_8_ = local_5c0;
    auVar63._16_8_ = uStack_5b0;
    auVar63._24_8_ = uStack_5a8;
    auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar150,auVar63);
    local_8a0._0_4_ = auVar236._0_4_ * fVar255;
    local_8a0._4_4_ = auVar236._4_4_ * fVar255;
    local_8a0._8_4_ = auVar236._8_4_ * fVar255;
    local_8a0._12_4_ = auVar236._12_4_ * fVar255;
    local_8a0._16_4_ = fVar255 * 0.0;
    local_8a0._20_4_ = fVar255 * 0.0;
    local_8a0._24_4_ = fVar255 * 0.0;
    local_8a0._28_4_ = 0;
    fVar181 = auVar84._0_4_ * fVar255;
    fVar196 = auVar84._4_4_ * fVar255;
    local_b60._4_4_ = fVar196;
    local_b60._0_4_ = fVar181;
    fVar197 = auVar84._8_4_ * fVar255;
    local_b60._8_4_ = fVar197;
    fVar198 = auVar84._12_4_ * fVar255;
    local_b60._12_4_ = fVar198;
    local_b60._16_4_ = fVar255 * 0.0;
    local_b60._20_4_ = fVar255 * 0.0;
    local_b60._24_4_ = fVar255 * 0.0;
    local_b60._28_4_ = local_300._28_4_;
    local_8c0._0_4_ = auVar123._0_4_ * fVar255;
    local_8c0._4_4_ = auVar123._4_4_ * fVar255;
    local_8c0._8_4_ = auVar123._8_4_ * fVar255;
    local_8c0._12_4_ = auVar123._12_4_ * fVar255;
    local_8c0._16_4_ = fVar255 * 0.0;
    local_8c0._20_4_ = fVar255 * 0.0;
    local_8c0._24_4_ = fVar255 * 0.0;
    local_8c0._28_4_ = 0;
    auVar191._0_4_ = fVar255 * auVar158._0_4_;
    auVar191._4_4_ = fVar255 * auVar158._4_4_;
    auVar191._8_4_ = fVar255 * auVar158._8_4_;
    auVar191._12_4_ = fVar255 * auVar158._12_4_;
    auVar191._16_4_ = fVar255 * 0.0;
    auVar191._20_4_ = fVar255 * 0.0;
    auVar191._24_4_ = fVar255 * 0.0;
    auVar191._28_4_ = 0;
    local_b80 = vpermps_avx2(_DAT_01fb7720,auVar100);
    auVar16 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar89));
    local_260 = vsubps_avx(local_b80,auVar100);
    auVar12 = vsubps_avx(auVar16,ZEXT1632(auVar89));
    fVar115 = auVar12._0_4_;
    fVar116 = auVar12._4_4_;
    auVar283._4_4_ = fVar116 * local_8a0._4_4_;
    auVar283._0_4_ = fVar115 * local_8a0._0_4_;
    fVar117 = auVar12._8_4_;
    auVar283._8_4_ = fVar117 * local_8a0._8_4_;
    fVar118 = auVar12._12_4_;
    auVar283._12_4_ = fVar118 * local_8a0._12_4_;
    fVar119 = auVar12._16_4_;
    auVar283._16_4_ = fVar119 * local_8a0._16_4_;
    fVar120 = auVar12._20_4_;
    auVar283._20_4_ = fVar120 * local_8a0._20_4_;
    fVar138 = auVar12._24_4_;
    auVar283._24_4_ = fVar138 * local_8a0._24_4_;
    auVar283._28_4_ = auVar128._28_4_;
    auVar236 = vfmsub231ps_fma(auVar283,local_8c0,local_260);
    local_b40 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar85));
    local_280 = vsubps_avx(local_b40,ZEXT1632(auVar85));
    fVar246 = local_260._0_4_;
    fVar248 = local_260._4_4_;
    auVar224._4_4_ = fVar248 * fVar196;
    auVar224._0_4_ = fVar246 * fVar181;
    fVar181 = local_260._8_4_;
    auVar224._8_4_ = fVar181 * fVar197;
    fVar250 = local_260._12_4_;
    auVar224._12_4_ = fVar250 * fVar198;
    fVar198 = local_260._16_4_;
    auVar224._16_4_ = fVar198 * fVar255 * 0.0;
    fVar252 = local_260._20_4_;
    auVar224._20_4_ = fVar252 * fVar255 * 0.0;
    fVar254 = local_260._24_4_;
    auVar224._24_4_ = fVar254 * fVar255 * 0.0;
    auVar224._28_4_ = local_b40._28_4_;
    auVar84 = vfmsub231ps_fma(auVar224,local_8a0,local_280);
    auVar236 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar84._12_4_ * auVar84._12_4_,
                                                  CONCAT48(auVar84._8_4_ * auVar84._8_4_,
                                                           CONCAT44(auVar84._4_4_ * auVar84._4_4_,
                                                                    auVar84._0_4_ * auVar84._0_4_)))
                                       ),ZEXT1632(auVar236),ZEXT1632(auVar236));
    fVar155 = local_280._0_4_;
    auVar214._0_4_ = fVar155 * (float)local_8c0._0_4_;
    fVar156 = local_280._4_4_;
    auVar214._4_4_ = fVar156 * local_8c0._4_4_;
    fVar157 = local_280._8_4_;
    auVar214._8_4_ = fVar157 * local_8c0._8_4_;
    fVar233 = local_280._12_4_;
    auVar214._12_4_ = fVar233 * local_8c0._12_4_;
    fVar244 = local_280._16_4_;
    auVar214._16_4_ = fVar244 * local_8c0._16_4_;
    fVar245 = local_280._20_4_;
    auVar214._20_4_ = fVar245 * local_8c0._20_4_;
    fVar247 = local_280._24_4_;
    auVar214._24_4_ = fVar247 * local_8c0._24_4_;
    auVar214._28_4_ = 0;
    auVar84 = vfmsub231ps_fma(auVar214,local_b60,auVar12);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar236),ZEXT1632(auVar84),ZEXT1632(auVar84));
    auVar215._0_4_ = fVar115 * fVar115;
    auVar215._4_4_ = fVar116 * fVar116;
    auVar215._8_4_ = fVar117 * fVar117;
    auVar215._12_4_ = fVar118 * fVar118;
    auVar215._16_4_ = fVar119 * fVar119;
    auVar215._20_4_ = fVar120 * fVar120;
    auVar215._24_4_ = fVar138 * fVar138;
    auVar215._28_4_ = 0;
    auVar236 = vfmadd231ps_fma(auVar215,local_280,local_280);
    auVar123 = vfmadd231ps_fma(ZEXT1632(auVar236),local_260,local_260);
    auVar98 = vrcpps_avx(ZEXT1632(auVar123));
    auVar101._8_4_ = 0x3f800000;
    auVar101._0_8_ = 0x3f8000003f800000;
    auVar101._12_4_ = 0x3f800000;
    auVar101._16_4_ = 0x3f800000;
    auVar101._20_4_ = 0x3f800000;
    auVar101._24_4_ = 0x3f800000;
    auVar101._28_4_ = 0x3f800000;
    auVar236 = vfnmadd213ps_fma(auVar98,ZEXT1632(auVar123),auVar101);
    auVar236 = vfmadd132ps_fma(ZEXT1632(auVar236),auVar98,auVar98);
    auVar150 = vpermps_avx2(_DAT_01fb7720,local_8a0);
    auVar225 = vpermps_avx2(_DAT_01fb7720,local_8c0);
    auVar15._4_4_ = fVar116 * auVar150._4_4_;
    auVar15._0_4_ = fVar115 * auVar150._0_4_;
    auVar15._8_4_ = fVar117 * auVar150._8_4_;
    auVar15._12_4_ = fVar118 * auVar150._12_4_;
    auVar15._16_4_ = fVar119 * auVar150._16_4_;
    auVar15._20_4_ = fVar120 * auVar150._20_4_;
    auVar15._24_4_ = fVar138 * auVar150._24_4_;
    auVar15._28_4_ = auVar98._28_4_;
    auVar158 = vfmsub231ps_fma(auVar15,auVar225,local_260);
    local_ac0 = vpermps_avx2(_DAT_01fb7720,local_b60);
    auVar19._4_4_ = fVar248 * local_ac0._4_4_;
    auVar19._0_4_ = fVar246 * local_ac0._0_4_;
    auVar19._8_4_ = fVar181 * local_ac0._8_4_;
    auVar19._12_4_ = fVar250 * local_ac0._12_4_;
    auVar19._16_4_ = fVar198 * local_ac0._16_4_;
    auVar19._20_4_ = fVar252 * local_ac0._20_4_;
    auVar19._24_4_ = fVar254 * local_ac0._24_4_;
    auVar19._28_4_ = 0;
    auVar142 = vfmsub231ps_fma(auVar19,auVar150,local_280);
    auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar142._12_4_ * auVar142._12_4_,
                                                  CONCAT48(auVar142._8_4_ * auVar142._8_4_,
                                                           CONCAT44(auVar142._4_4_ * auVar142._4_4_,
                                                                    auVar142._0_4_ * auVar142._0_4_)
                                                          ))),ZEXT1632(auVar158),ZEXT1632(auVar158))
    ;
    auVar222._0_4_ = fVar155 * auVar225._0_4_;
    auVar222._4_4_ = fVar156 * auVar225._4_4_;
    auVar222._8_4_ = fVar157 * auVar225._8_4_;
    auVar222._12_4_ = fVar233 * auVar225._12_4_;
    auVar222._16_4_ = fVar244 * auVar225._16_4_;
    auVar222._20_4_ = fVar245 * auVar225._20_4_;
    auVar222._24_4_ = fVar247 * auVar225._24_4_;
    auVar222._28_4_ = 0;
    auVar142 = vfmsub231ps_fma(auVar222,local_ac0,auVar12);
    auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),ZEXT1632(auVar142),ZEXT1632(auVar142));
    auVar98 = vmaxps_avx(ZEXT1632(CONCAT412(auVar236._12_4_ * auVar84._12_4_,
                                            CONCAT48(auVar236._8_4_ * auVar84._8_4_,
                                                     CONCAT44(auVar236._4_4_ * auVar84._4_4_,
                                                              auVar236._0_4_ * auVar84._0_4_)))),
                         ZEXT1632(CONCAT412(auVar158._12_4_ * auVar236._12_4_,
                                            CONCAT48(auVar158._8_4_ * auVar236._8_4_,
                                                     CONCAT44(auVar158._4_4_ * auVar236._4_4_,
                                                              auVar158._0_4_ * auVar236._0_4_)))));
    local_940._0_4_ = auVar191._0_4_ + auVar122._0_4_;
    local_940._4_4_ = auVar191._4_4_ + auVar122._4_4_;
    local_940._8_4_ = auVar191._8_4_ + auVar122._8_4_;
    local_940._12_4_ = auVar191._12_4_ + auVar122._12_4_;
    local_940._16_4_ = auVar191._16_4_ + 0.0;
    local_940._20_4_ = auVar191._20_4_ + 0.0;
    local_940._24_4_ = auVar191._24_4_ + 0.0;
    local_940._28_4_ = 0;
    auVar128 = vsubps_avx(ZEXT1632(auVar122),auVar191);
    auVar17 = vpermps_avx2(_DAT_01fb7720,auVar128);
    local_920 = ZEXT1632(auVar122);
    auVar18 = vpermps_avx2(_DAT_01fb7720,local_920);
    auVar128 = vmaxps_avx(local_920,local_940);
    auVar8 = vmaxps_avx(auVar17,auVar18);
    auVar128 = vmaxps_avx(auVar128,auVar8);
    auVar8 = vrsqrtps_avx(ZEXT1632(auVar123));
    fVar196 = auVar8._0_4_;
    fVar197 = auVar8._4_4_;
    fVar82 = auVar8._8_4_;
    fVar180 = auVar8._12_4_;
    fVar255 = auVar8._16_4_;
    fVar227 = auVar8._20_4_;
    fVar81 = auVar8._24_4_;
    auVar20._4_4_ = fVar197 * fVar197 * fVar197 * auVar123._4_4_ * -0.5;
    auVar20._0_4_ = fVar196 * fVar196 * fVar196 * auVar123._0_4_ * -0.5;
    auVar20._8_4_ = fVar82 * fVar82 * fVar82 * auVar123._8_4_ * -0.5;
    auVar20._12_4_ = fVar180 * fVar180 * fVar180 * auVar123._12_4_ * -0.5;
    auVar20._16_4_ = fVar255 * fVar255 * fVar255 * -0.0;
    auVar20._20_4_ = fVar227 * fVar227 * fVar227 * -0.0;
    auVar20._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
    auVar20._28_4_ = auVar18._28_4_;
    auVar192._8_4_ = 0x3fc00000;
    auVar192._0_8_ = 0x3fc000003fc00000;
    auVar192._12_4_ = 0x3fc00000;
    auVar192._16_4_ = 0x3fc00000;
    auVar192._20_4_ = 0x3fc00000;
    auVar192._24_4_ = 0x3fc00000;
    auVar192._28_4_ = 0x3fc00000;
    auVar236 = vfmadd231ps_fma(auVar20,auVar192,auVar8);
    fVar196 = auVar236._0_4_;
    fVar197 = auVar236._4_4_;
    auVar21._4_4_ = fVar156 * fVar197;
    auVar21._0_4_ = fVar155 * fVar196;
    fVar82 = auVar236._8_4_;
    auVar21._8_4_ = fVar157 * fVar82;
    fVar180 = auVar236._12_4_;
    auVar21._12_4_ = fVar233 * fVar180;
    auVar21._16_4_ = fVar244 * 0.0;
    auVar21._20_4_ = fVar245 * 0.0;
    uVar77 = auVar8._28_4_;
    auVar21._24_4_ = fVar247 * 0.0;
    auVar21._28_4_ = uVar77;
    auVar22._4_4_ = (float)local_960._4_4_ * fVar116 * fVar197;
    auVar22._0_4_ = (float)local_960._0_4_ * fVar115 * fVar196;
    auVar22._8_4_ = fStack_958 * fVar117 * fVar82;
    auVar22._12_4_ = fStack_954 * fVar118 * fVar180;
    auVar22._16_4_ = fStack_950 * fVar119 * 0.0;
    auVar22._20_4_ = fStack_94c * fVar120 * 0.0;
    auVar22._24_4_ = fStack_948 * fVar138 * 0.0;
    auVar22._28_4_ = auVar225._28_4_;
    auVar122 = vfmadd231ps_fma(auVar22,auVar21,_local_860);
    auVar271 = ZEXT1632(auVar89);
    local_ae0 = vsubps_avx(ZEXT832(0) << 0x20,auVar271);
    fVar155 = local_ae0._0_4_;
    fVar156 = local_ae0._4_4_;
    auVar23._4_4_ = fVar156 * fVar116 * fVar197;
    auVar23._0_4_ = fVar155 * fVar115 * fVar196;
    fVar157 = local_ae0._8_4_;
    auVar23._8_4_ = fVar157 * fVar117 * fVar82;
    fVar117 = local_ae0._12_4_;
    auVar23._12_4_ = fVar117 * fVar118 * fVar180;
    fVar118 = local_ae0._16_4_;
    auVar23._16_4_ = fVar118 * fVar119 * 0.0;
    fVar119 = local_ae0._20_4_;
    auVar23._20_4_ = fVar119 * fVar120 * 0.0;
    fVar120 = local_ae0._24_4_;
    auVar23._24_4_ = fVar120 * fVar138 * 0.0;
    auVar23._28_4_ = 0x3fc00000;
    auVar283 = ZEXT1632(auVar85);
    auVar282 = vsubps_avx(ZEXT832(0) << 0x20,auVar283);
    auVar226 = ZEXT3264(auVar282);
    auVar85 = vfmadd231ps_fma(auVar23,auVar282,auVar21);
    auVar24._4_4_ = fVar197 * fVar248;
    auVar24._0_4_ = fVar196 * fVar246;
    auVar24._8_4_ = fVar82 * fVar181;
    auVar24._12_4_ = fVar180 * fVar250;
    auVar24._16_4_ = fVar198 * 0.0;
    auVar24._20_4_ = fVar252 * 0.0;
    auVar24._24_4_ = fVar254 * 0.0;
    auVar24._28_4_ = uVar77;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar24,_local_980);
    auVar278 = ZEXT832(0) << 0x20;
    auVar104 = vsubps_avx(auVar278,auVar100);
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,auVar24);
    auVar8 = vsqrtps_avx(auVar98);
    auVar25._4_4_ = fVar156 * (float)local_960._4_4_;
    auVar25._0_4_ = fVar155 * (float)local_960._0_4_;
    auVar25._8_4_ = fVar157 * fStack_958;
    auVar25._12_4_ = fVar117 * fStack_954;
    auVar25._16_4_ = fVar118 * fStack_950;
    auVar25._20_4_ = fVar119 * fStack_94c;
    auVar25._24_4_ = fVar120 * fStack_948;
    auVar25._28_4_ = uVar77;
    auVar122 = vfmadd231ps_fma(auVar25,_local_860,auVar282);
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),_local_980,auVar104);
    fVar181 = auVar85._0_4_;
    fVar227 = auVar89._0_4_;
    fVar198 = auVar85._4_4_;
    fVar81 = auVar89._4_4_;
    fVar246 = auVar85._8_4_;
    fVar115 = auVar89._8_4_;
    fVar248 = auVar85._12_4_;
    fVar116 = auVar89._12_4_;
    auVar26._28_4_ = auVar98._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar116 * fVar248,
                            CONCAT48(fVar115 * fVar246,CONCAT44(fVar81 * fVar198,fVar227 * fVar181))
                           ));
    auVar13 = vsubps_avx(ZEXT1632(auVar122),auVar26);
    auVar27._4_4_ = fVar156 * fVar156;
    auVar27._0_4_ = fVar155 * fVar155;
    auVar27._8_4_ = fVar157 * fVar157;
    auVar27._12_4_ = fVar117 * fVar117;
    auVar27._16_4_ = fVar118 * fVar118;
    auVar27._20_4_ = fVar119 * fVar119;
    auVar27._24_4_ = fVar120 * fVar120;
    auVar27._28_4_ = auVar98._28_4_;
    auVar122 = vfmadd231ps_fma(auVar27,auVar282,auVar282);
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar104,auVar104);
    auVar28._28_4_ = local_ae0._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar248 * fVar248,
                            CONCAT48(fVar246 * fVar246,CONCAT44(fVar198 * fVar198,fVar181 * fVar181)
                                    )));
    auVar216 = vsubps_avx(ZEXT1632(auVar122),auVar28);
    fVar255 = auVar128._28_4_ + auVar8._28_4_;
    fVar181 = (auVar128._0_4_ + auVar8._0_4_) * 1.0000002;
    fVar198 = (auVar128._4_4_ + auVar8._4_4_) * 1.0000002;
    fVar246 = (auVar128._8_4_ + auVar8._8_4_) * 1.0000002;
    fVar248 = (auVar128._12_4_ + auVar8._12_4_) * 1.0000002;
    fVar250 = (auVar128._16_4_ + auVar8._16_4_) * 1.0000002;
    fVar252 = (auVar128._20_4_ + auVar8._20_4_) * 1.0000002;
    fVar254 = (auVar128._24_4_ + auVar8._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar198 * fVar198;
    auVar29._0_4_ = fVar181 * fVar181;
    auVar29._8_4_ = fVar246 * fVar246;
    auVar29._12_4_ = fVar248 * fVar248;
    auVar29._16_4_ = fVar250 * fVar250;
    auVar29._20_4_ = fVar252 * fVar252;
    auVar29._24_4_ = fVar254 * fVar254;
    auVar29._28_4_ = fVar255;
    local_3a0._0_4_ = auVar13._0_4_ + auVar13._0_4_;
    local_3a0._4_4_ = auVar13._4_4_ + auVar13._4_4_;
    local_3a0._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    local_3a0._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    local_3a0._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    local_3a0._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    local_3a0._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    fVar181 = auVar13._28_4_;
    local_3a0._28_4_ = fVar181 + fVar181;
    auVar270 = ZEXT3264(local_3a0);
    auVar128 = vsubps_avx(auVar216,auVar29);
    local_2c0 = ZEXT1632(auVar89);
    local_2a0._28_4_ = local_980._28_4_;
    local_2a0._0_28_ =
         ZEXT1628(CONCAT412(fVar116 * fVar116,
                            CONCAT48(fVar115 * fVar115,CONCAT44(fVar81 * fVar81,fVar227 * fVar227)))
                 );
    auVar13 = vsubps_avx(local_220,local_2a0);
    auVar210 = ZEXT3264(auVar13);
    auVar30._4_4_ = local_3a0._4_4_ * local_3a0._4_4_;
    auVar30._0_4_ = local_3a0._0_4_ * local_3a0._0_4_;
    auVar30._8_4_ = local_3a0._8_4_ * local_3a0._8_4_;
    auVar30._12_4_ = local_3a0._12_4_ * local_3a0._12_4_;
    auVar30._16_4_ = local_3a0._16_4_ * local_3a0._16_4_;
    auVar30._20_4_ = local_3a0._20_4_ * local_3a0._20_4_;
    auVar30._24_4_ = local_3a0._24_4_ * local_3a0._24_4_;
    auVar30._28_4_ = fVar255;
    fVar198 = auVar13._0_4_;
    fVar246 = auVar13._4_4_;
    fVar248 = auVar13._8_4_;
    fVar250 = auVar13._12_4_;
    fVar252 = auVar13._16_4_;
    fVar254 = auVar13._20_4_;
    fVar255 = auVar13._24_4_;
    auVar31._4_4_ = auVar128._4_4_ * fVar246 * 4.0;
    auVar31._0_4_ = auVar128._0_4_ * fVar198 * 4.0;
    auVar31._8_4_ = auVar128._8_4_ * fVar248 * 4.0;
    auVar31._12_4_ = auVar128._12_4_ * fVar250 * 4.0;
    auVar31._16_4_ = auVar128._16_4_ * fVar252 * 4.0;
    auVar31._20_4_ = auVar128._20_4_ * fVar254 * 4.0;
    auVar31._24_4_ = auVar128._24_4_ * fVar255 * 4.0;
    auVar31._28_4_ = fVar181;
    auVar14 = vsubps_avx(auVar30,auVar31);
    auVar98 = vcmpps_avx(auVar14,auVar278,5);
    local_380._0_4_ = fVar198 + fVar198;
    local_380._4_4_ = fVar246 + fVar246;
    local_380._8_4_ = fVar248 + fVar248;
    local_380._12_4_ = fVar250 + fVar250;
    local_380._16_4_ = fVar252 + fVar252;
    local_380._20_4_ = fVar254 + fVar254;
    local_380._24_4_ = fVar255 + fVar255;
    local_380._28_4_ = auVar13._28_4_ + auVar13._28_4_;
    auVar193 = ZEXT1632(auVar85);
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0x7f,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar98 >> 0xbf,0) == '\0') &&
        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f]) {
      auVar267 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
    }
    else {
      auVar224 = vsqrtps_avx(auVar14);
      auVar278 = vcmpps_avx(auVar14,auVar278,5);
      auVar14 = vrcpps_avx(local_380);
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = 0x3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar129._16_4_ = 0x3f800000;
      auVar129._20_4_ = 0x3f800000;
      auVar129._24_4_ = 0x3f800000;
      auVar129._28_4_ = 0x3f800000;
      auVar85 = vfnmadd213ps_fma(auVar14,local_380,auVar129);
      auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar14,auVar14);
      uVar76 = CONCAT44(local_3a0._4_4_,local_3a0._0_4_);
      auVar284._0_8_ = uVar76 ^ 0x8000000080000000;
      auVar284._8_4_ = -local_3a0._8_4_;
      auVar284._12_4_ = -local_3a0._12_4_;
      auVar284._16_4_ = -local_3a0._16_4_;
      auVar284._20_4_ = -local_3a0._20_4_;
      auVar284._24_4_ = -local_3a0._24_4_;
      auVar284._28_4_ = -local_3a0._28_4_;
      auVar14 = vsubps_avx(auVar284,auVar224);
      auVar32._4_4_ = auVar14._4_4_ * auVar85._4_4_;
      auVar32._0_4_ = auVar14._0_4_ * auVar85._0_4_;
      auVar32._8_4_ = auVar14._8_4_ * auVar85._8_4_;
      auVar32._12_4_ = auVar14._12_4_ * auVar85._12_4_;
      auVar32._16_4_ = auVar14._16_4_ * 0.0;
      auVar32._20_4_ = auVar14._20_4_ * 0.0;
      auVar32._24_4_ = auVar14._24_4_ * 0.0;
      auVar32._28_4_ = auVar14._28_4_;
      auVar14 = vsubps_avx(auVar224,local_3a0);
      auVar280._0_4_ = auVar14._0_4_ * auVar85._0_4_;
      auVar280._4_4_ = auVar14._4_4_ * auVar85._4_4_;
      auVar280._8_4_ = auVar14._8_4_ * auVar85._8_4_;
      auVar280._12_4_ = auVar14._12_4_ * auVar85._12_4_;
      auVar280._16_4_ = auVar14._16_4_ * 0.0;
      auVar280._20_4_ = auVar14._20_4_ * 0.0;
      auVar280._24_4_ = auVar14._24_4_ * 0.0;
      auVar280._28_4_ = 0;
      auVar85 = vfmadd213ps_fma(local_2c0,auVar32,auVar193);
      local_340 = ZEXT1632(CONCAT412(fVar180 * auVar85._12_4_,
                                     CONCAT48(fVar82 * auVar85._8_4_,
                                              CONCAT44(fVar197 * auVar85._4_4_,
                                                       fVar196 * auVar85._0_4_))));
      auVar14 = vandps_avx(local_880,local_2a0);
      auVar14 = vmaxps_avx(local_720,auVar14);
      auVar33._4_4_ = auVar14._4_4_ * 1.9073486e-06;
      auVar33._0_4_ = auVar14._0_4_ * 1.9073486e-06;
      auVar33._8_4_ = auVar14._8_4_ * 1.9073486e-06;
      auVar33._12_4_ = auVar14._12_4_ * 1.9073486e-06;
      auVar33._16_4_ = auVar14._16_4_ * 1.9073486e-06;
      auVar33._20_4_ = auVar14._20_4_ * 1.9073486e-06;
      auVar33._24_4_ = auVar14._24_4_ * 1.9073486e-06;
      auVar33._28_4_ = auVar14._28_4_;
      auVar14 = vandps_avx(local_880,auVar13);
      auVar224 = vcmpps_avx(auVar14,auVar33,1);
      auVar85 = vfmadd213ps_fma(local_2c0,auVar280,auVar193);
      auVar102._8_4_ = 0x7f800000;
      auVar102._0_8_ = 0x7f8000007f800000;
      auVar102._12_4_ = 0x7f800000;
      auVar102._16_4_ = 0x7f800000;
      auVar102._20_4_ = 0x7f800000;
      auVar102._24_4_ = 0x7f800000;
      auVar102._28_4_ = 0x7f800000;
      auVar14 = vblendvps_avx(auVar102,auVar32,auVar278);
      auVar267 = ZEXT3264(auVar14);
      local_360 = fVar196 * auVar85._0_4_;
      fStack_35c = fVar197 * auVar85._4_4_;
      fStack_358 = fVar82 * auVar85._8_4_;
      fStack_354 = fVar180 * auVar85._12_4_;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = 0x7f800000;
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar279 = vblendvps_avx(auVar272,auVar280,auVar278);
      auVar15 = auVar278 & auVar224;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar98 = vandps_avx(auVar224,auVar278);
        auVar224 = vcmpps_avx(auVar128,_DAT_01f7b000,2);
        auVar112._8_4_ = 0x7f800000;
        auVar112._0_8_ = 0x7f8000007f800000;
        auVar112._12_4_ = 0x7f800000;
        auVar112._16_4_ = 0x7f800000;
        auVar112._20_4_ = 0x7f800000;
        auVar112._24_4_ = 0x7f800000;
        auVar112._28_4_ = 0x7f800000;
        auVar287._8_4_ = 0xff800000;
        auVar287._0_8_ = 0xff800000ff800000;
        auVar287._12_4_ = 0xff800000;
        auVar287._16_4_ = 0xff800000;
        auVar287._20_4_ = 0xff800000;
        auVar287._24_4_ = 0xff800000;
        auVar287._28_4_ = 0xff800000;
        auVar128 = vblendvps_avx(auVar112,auVar287,auVar224);
        auVar85 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
        auVar15 = vpmovsxwd_avx2(auVar85);
        auVar128 = vblendvps_avx(auVar14,auVar128,auVar15);
        auVar267 = ZEXT3264(auVar128);
        auVar113._8_4_ = 0xff800000;
        auVar113._0_8_ = 0xff800000ff800000;
        auVar113._12_4_ = 0xff800000;
        auVar113._16_4_ = 0xff800000;
        auVar113._20_4_ = 0xff800000;
        auVar113._24_4_ = 0xff800000;
        auVar113._28_4_ = 0xff800000;
        auVar288._8_4_ = 0x7f800000;
        auVar288._0_8_ = 0x7f8000007f800000;
        auVar288._12_4_ = 0x7f800000;
        auVar288._16_4_ = 0x7f800000;
        auVar288._20_4_ = 0x7f800000;
        auVar288._24_4_ = 0x7f800000;
        auVar288._28_4_ = 0x7f800000;
        auVar128 = vblendvps_avx(auVar113,auVar288,auVar224);
        auVar279 = vblendvps_avx(auVar279,auVar128,auVar15);
        auVar242._0_8_ = auVar98._0_8_ ^ 0xffffffffffffffff;
        auVar242._8_4_ = auVar98._8_4_ ^ 0xffffffff;
        auVar242._12_4_ = auVar98._12_4_ ^ 0xffffffff;
        auVar242._16_4_ = auVar98._16_4_ ^ 0xffffffff;
        auVar242._20_4_ = auVar98._20_4_ ^ 0xffffffff;
        auVar242._24_4_ = auVar98._24_4_ ^ 0xffffffff;
        auVar242._28_4_ = auVar98._28_4_ ^ 0xffffffff;
        auVar98 = vorps_avx(auVar224,auVar242);
        auVar98 = vandps_avx(auVar98,auVar278);
      }
    }
    auVar262 = ZEXT3264(_local_a60);
    auVar243 = ZEXT3264(local_700);
    auVar128 = local_700 & auVar98;
    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar128 >> 0x7f,0) != '\0') ||
          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar128 >> 0xbf,0) != '\0') ||
        (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar128[0x1f] < '\0') {
      local_840 = ZEXT1632(auVar236);
      auVar137 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      fVar181 = *(float *)(ray + k * 4 + 0x100) - (float)local_a20._0_4_;
      auVar173._4_4_ = fVar181;
      auVar173._0_4_ = fVar181;
      auVar173._8_4_ = fVar181;
      auVar173._12_4_ = fVar181;
      auVar173._16_4_ = fVar181;
      auVar173._20_4_ = fVar181;
      auVar173._24_4_ = fVar181;
      auVar173._28_4_ = fVar181;
      auVar278 = vminps_avx(auVar173,auVar279);
      auVar229._0_4_ = (float)local_8c0._0_4_ * fVar155;
      auVar229._4_4_ = local_8c0._4_4_ * fVar156;
      auVar229._8_4_ = local_8c0._8_4_ * fVar157;
      auVar229._12_4_ = local_8c0._12_4_ * fVar117;
      auVar229._16_4_ = local_8c0._16_4_ * fVar118;
      auVar229._20_4_ = local_8c0._20_4_ * fVar119;
      auVar229._24_4_ = local_8c0._24_4_ * fVar120;
      auVar229._28_4_ = 0;
      auVar236 = vfmadd213ps_fma(auVar282,local_b60,auVar229);
      auVar67._4_4_ = fStack_31c;
      auVar67._0_4_ = local_320;
      auVar67._8_4_ = fStack_318;
      auVar67._12_4_ = fStack_314;
      auVar67._16_4_ = fStack_310;
      auVar67._20_4_ = fStack_30c;
      auVar67._24_4_ = fStack_308;
      auVar67._28_4_ = fStack_304;
      auVar14 = vmaxps_avx(auVar67,auVar267._0_32_);
      auVar85 = vfmadd213ps_fma(auVar104,local_8a0,ZEXT1632(auVar236));
      auVar223._0_4_ = (float)local_8c0._0_4_ * (float)local_960._0_4_;
      auVar223._4_4_ = local_8c0._4_4_ * (float)local_960._4_4_;
      auVar223._8_4_ = local_8c0._8_4_ * fStack_958;
      auVar223._12_4_ = local_8c0._12_4_ * fStack_954;
      auVar223._16_4_ = local_8c0._16_4_ * fStack_950;
      auVar223._20_4_ = local_8c0._20_4_ * fStack_94c;
      auVar223._24_4_ = local_8c0._24_4_ * fStack_948;
      auVar223._28_4_ = 0;
      auVar236 = vfmadd231ps_fma(auVar223,_local_860,local_b60);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar236),local_8a0,_local_980);
      auVar128 = vandps_avx(ZEXT1632(auVar89),local_880);
      auVar103._8_4_ = 0x219392ef;
      auVar103._0_8_ = 0x219392ef219392ef;
      auVar103._12_4_ = 0x219392ef;
      auVar103._16_4_ = 0x219392ef;
      auVar103._20_4_ = 0x219392ef;
      auVar103._24_4_ = 0x219392ef;
      auVar103._28_4_ = 0x219392ef;
      auVar282 = vcmpps_avx(auVar128,auVar103,1);
      auVar128 = vrcpps_avx(ZEXT1632(auVar89));
      auVar269._8_4_ = 0x3f800000;
      auVar269._0_8_ = 0x3f8000003f800000;
      auVar269._12_4_ = 0x3f800000;
      auVar269._16_4_ = 0x3f800000;
      auVar269._20_4_ = 0x3f800000;
      auVar269._24_4_ = 0x3f800000;
      auVar269._28_4_ = 0x3f800000;
      auVar270 = ZEXT3264(auVar269);
      auVar224 = ZEXT1632(auVar89);
      auVar236 = vfnmadd213ps_fma(auVar128,auVar224,auVar269);
      auVar236 = vfmadd132ps_fma(ZEXT1632(auVar236),auVar128,auVar128);
      auVar273._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
      auVar273._8_4_ = auVar89._8_4_ ^ 0x80000000;
      auVar273._12_4_ = auVar89._12_4_ ^ 0x80000000;
      auVar273._16_4_ = 0x80000000;
      auVar273._20_4_ = 0x80000000;
      auVar273._24_4_ = 0x80000000;
      auVar273._28_4_ = 0x80000000;
      auVar281._0_4_ = auVar236._0_4_ * -auVar85._0_4_;
      auVar281._4_4_ = auVar236._4_4_ * -auVar85._4_4_;
      auVar281._8_4_ = auVar236._8_4_ * -auVar85._8_4_;
      auVar281._12_4_ = auVar236._12_4_ * -auVar85._12_4_;
      auVar281._16_4_ = 0x80000000;
      auVar281._20_4_ = 0x80000000;
      auVar281._24_4_ = 0x80000000;
      auVar281._28_4_ = 0;
      auVar128 = vcmpps_avx(auVar224,auVar273,1);
      auVar128 = vorps_avx(auVar282,auVar128);
      auVar285._8_4_ = 0xff800000;
      auVar285._0_8_ = 0xff800000ff800000;
      auVar285._12_4_ = 0xff800000;
      auVar285._16_4_ = 0xff800000;
      auVar285._20_4_ = 0xff800000;
      auVar285._24_4_ = 0xff800000;
      auVar285._28_4_ = 0xff800000;
      auVar128 = vblendvps_avx(auVar281,auVar285,auVar128);
      auVar104 = vmaxps_avx(auVar14,auVar128);
      auVar128 = vcmpps_avx(auVar224,auVar273,6);
      auVar128 = vorps_avx(auVar282,auVar128);
      auVar286._8_4_ = 0x7f800000;
      auVar286._0_8_ = 0x7f8000007f800000;
      auVar286._12_4_ = 0x7f800000;
      auVar286._16_4_ = 0x7f800000;
      auVar286._20_4_ = 0x7f800000;
      auVar286._24_4_ = 0x7f800000;
      auVar286._28_4_ = 0x7f800000;
      auVar128 = vblendvps_avx(auVar281,auVar286,auVar128);
      auVar14 = vminps_avx(auVar278,auVar128);
      fVar181 = -auVar225._0_4_;
      fVar227 = -auVar225._4_4_;
      fVar81 = -auVar225._8_4_;
      fVar115 = -auVar225._12_4_;
      fVar116 = -auVar225._16_4_;
      fVar117 = -auVar225._20_4_;
      fVar118 = -auVar225._24_4_;
      auVar230._0_8_ = local_ac0._0_8_ ^ 0x8000000080000000;
      auVar230._8_4_ = -local_ac0._8_4_;
      auVar230._12_4_ = -local_ac0._12_4_;
      auVar230._16_4_ = -local_ac0._16_4_;
      auVar230._20_4_ = -local_ac0._20_4_;
      auVar230._24_4_ = -local_ac0._24_4_;
      auVar230._28_4_ = local_ac0._28_4_ ^ 0x80000000;
      auVar282 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar128 = vsubps_avx(auVar282,local_b40);
      auVar282 = vsubps_avx(auVar282,auVar16);
      auVar34._4_4_ = auVar282._4_4_ * fVar227;
      auVar34._0_4_ = auVar282._0_4_ * fVar181;
      auVar34._8_4_ = auVar282._8_4_ * fVar81;
      auVar34._12_4_ = auVar282._12_4_ * fVar115;
      auVar34._16_4_ = auVar282._16_4_ * fVar116;
      auVar34._20_4_ = auVar282._20_4_ * fVar117;
      auVar34._24_4_ = auVar282._24_4_ * fVar118;
      auVar34._28_4_ = auVar282._28_4_;
      auVar236 = vfmadd231ps_fma(auVar34,auVar230,auVar128);
      uStack_c04 = auVar150._28_4_;
      auVar239._0_8_ = auVar150._0_8_ ^ 0x8000000080000000;
      auVar239._8_4_ = -auVar150._8_4_;
      auVar239._12_4_ = -auVar150._12_4_;
      auVar239._16_4_ = -auVar150._16_4_;
      auVar239._20_4_ = -auVar150._20_4_;
      auVar239._24_4_ = -auVar150._24_4_;
      auVar239._28_4_ = uStack_c04 ^ 0x80000000;
      auVar128 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,local_b80);
      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar239,auVar128);
      auVar35._4_4_ = fVar227 * (float)local_960._4_4_;
      auVar35._0_4_ = fVar181 * (float)local_960._0_4_;
      auVar35._8_4_ = fVar81 * fStack_958;
      auVar35._12_4_ = fVar115 * fStack_954;
      auVar35._16_4_ = fVar116 * fStack_950;
      auVar35._20_4_ = fVar117 * fStack_94c;
      auVar35._24_4_ = fVar118 * fStack_948;
      auVar35._28_4_ = auVar225._28_4_ ^ 0x80000000;
      auVar236 = vfmadd231ps_fma(auVar35,_local_860,auVar230);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar239,_local_980);
      auVar128 = vandps_avx(ZEXT1632(auVar89),local_880);
      auVar150 = vrcpps_avx(ZEXT1632(auVar89));
      auVar174._8_4_ = 0x219392ef;
      auVar174._0_8_ = 0x219392ef219392ef;
      auVar174._12_4_ = 0x219392ef;
      auVar174._16_4_ = 0x219392ef;
      auVar174._20_4_ = 0x219392ef;
      auVar174._24_4_ = 0x219392ef;
      auVar174._28_4_ = 0x219392ef;
      auVar282 = vcmpps_avx(auVar128,auVar174,1);
      auVar225 = ZEXT1632(auVar89);
      auVar236 = vfnmadd213ps_fma(auVar150,auVar225,auVar269);
      auVar236 = vfmadd132ps_fma(ZEXT1632(auVar236),auVar150,auVar150);
      local_9a0 = (undefined1  [8])(auVar89._0_8_ ^ 0x8000000080000000);
      fStack_998 = (float)(auVar89._8_4_ ^ 0x80000000);
      fStack_994 = (float)(auVar89._12_4_ ^ 0x80000000);
      fStack_990 = -0.0;
      fStack_98c = -0.0;
      fStack_988 = -0.0;
      fStack_984 = -0.0;
      auVar36._4_4_ = auVar236._4_4_ * -auVar85._4_4_;
      auVar36._0_4_ = auVar236._0_4_ * -auVar85._0_4_;
      auVar36._8_4_ = auVar236._8_4_ * -auVar85._8_4_;
      auVar36._12_4_ = auVar236._12_4_ * -auVar85._12_4_;
      auVar36._16_4_ = 0x80000000;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      auVar128 = vcmpps_avx(auVar225,_local_9a0,1);
      auVar128 = vorps_avx(auVar282,auVar128);
      auVar175._8_4_ = 0xff800000;
      auVar175._0_8_ = 0xff800000ff800000;
      auVar175._12_4_ = 0xff800000;
      auVar175._16_4_ = 0xff800000;
      auVar175._20_4_ = 0xff800000;
      auVar175._24_4_ = 0xff800000;
      auVar175._28_4_ = 0xff800000;
      auVar128 = vblendvps_avx(auVar36,auVar175,auVar128);
      local_a80 = vmaxps_avx(auVar104,auVar128);
      auVar128 = vcmpps_avx(auVar225,_local_9a0,6);
      auVar128 = vorps_avx(auVar282,auVar128);
      auVar176._8_4_ = 0x7f800000;
      auVar176._0_8_ = 0x7f8000007f800000;
      auVar176._12_4_ = 0x7f800000;
      auVar176._16_4_ = 0x7f800000;
      auVar176._20_4_ = 0x7f800000;
      auVar176._24_4_ = 0x7f800000;
      auVar176._28_4_ = 0x7f800000;
      auVar128 = vblendvps_avx(auVar36,auVar176,auVar128);
      local_9c0 = vandps_avx(auVar98,local_700);
      local_3c0 = vminps_avx(auVar14,auVar128);
      auVar98 = vcmpps_avx(local_a80,local_3c0,2);
      auVar128 = local_9c0 & auVar98;
      auVar265 = _local_860;
      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar128 >> 0x7f,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar128 >> 0xbf,0) != '\0') ||
          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar128[0x1f] < '\0') {
        auVar207._8_4_ = 0x3f800000;
        auVar207._0_8_ = 0x3f8000003f800000;
        auVar207._12_4_ = 0x3f800000;
        auVar207._16_4_ = 0x3f800000;
        auVar207._20_4_ = 0x3f800000;
        auVar207._24_4_ = 0x3f800000;
        auVar207._28_4_ = 0x3f800000;
        auVar128 = vminps_avx(local_340,auVar207);
        auVar128 = vmaxps_avx(auVar128,ZEXT832(0) << 0x20);
        auVar66._4_4_ = fStack_35c;
        auVar66._0_4_ = local_360;
        auVar66._8_4_ = fStack_358;
        auVar66._12_4_ = fStack_354;
        auVar66._16_4_ = uStack_350;
        auVar66._20_4_ = uStack_34c;
        auVar66._24_4_ = uStack_348;
        auVar66._28_4_ = uStack_344;
        auVar282 = vminps_avx(auVar66,auVar207);
        auVar282 = vmaxps_avx(auVar282,ZEXT832(0) << 0x20);
        auVar37._4_4_ = (auVar128._4_4_ + 1.0) * 0.125;
        auVar37._0_4_ = (auVar128._0_4_ + 0.0) * 0.125;
        auVar37._8_4_ = (auVar128._8_4_ + 2.0) * 0.125;
        auVar37._12_4_ = (auVar128._12_4_ + 3.0) * 0.125;
        auVar37._16_4_ = (auVar128._16_4_ + 4.0) * 0.125;
        auVar37._20_4_ = (auVar128._20_4_ + 5.0) * 0.125;
        auVar37._24_4_ = (auVar128._24_4_ + 6.0) * 0.125;
        auVar37._28_4_ = auVar128._28_4_ + 7.0;
        auVar236 = vfmadd213ps_fma(auVar37,local_900,local_8e0);
        auVar38._4_4_ = (auVar282._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar282._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar282._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar282._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar282._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar282._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar282._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar282._28_4_ + 7.0;
        auVar85 = vfmadd213ps_fma(auVar38,local_900,local_8e0);
        auVar128 = vminps_avx(local_920,local_940);
        auVar282 = vminps_avx(auVar17,auVar18);
        auVar128 = vminps_avx(auVar128,auVar282);
        auVar8 = vsubps_avx(auVar128,auVar8);
        auVar128 = vandps_avx(auVar98,local_9c0);
        local_1a0 = ZEXT1632(auVar236);
        local_1c0 = ZEXT1632(auVar85);
        auVar39._4_4_ = auVar8._4_4_ * 0.99999976;
        auVar39._0_4_ = auVar8._0_4_ * 0.99999976;
        auVar39._8_4_ = auVar8._8_4_ * 0.99999976;
        auVar39._12_4_ = auVar8._12_4_ * 0.99999976;
        auVar39._16_4_ = auVar8._16_4_ * 0.99999976;
        auVar39._20_4_ = auVar8._20_4_ * 0.99999976;
        auVar39._24_4_ = auVar8._24_4_ * 0.99999976;
        auVar39._28_4_ = 0x3f7ffffc;
        auVar8 = vmaxps_avx(ZEXT832(0) << 0x20,auVar39);
        auVar40._4_4_ = auVar8._4_4_ * auVar8._4_4_;
        auVar40._0_4_ = auVar8._0_4_ * auVar8._0_4_;
        auVar40._8_4_ = auVar8._8_4_ * auVar8._8_4_;
        auVar40._12_4_ = auVar8._12_4_ * auVar8._12_4_;
        auVar40._16_4_ = auVar8._16_4_ * auVar8._16_4_;
        auVar40._20_4_ = auVar8._20_4_ * auVar8._20_4_;
        auVar40._24_4_ = auVar8._24_4_ * auVar8._24_4_;
        auVar40._28_4_ = auVar8._28_4_;
        auVar8 = vsubps_avx(auVar216,auVar40);
        auVar41._4_4_ = auVar8._4_4_ * fVar246 * 4.0;
        auVar41._0_4_ = auVar8._0_4_ * fVar198 * 4.0;
        auVar41._8_4_ = auVar8._8_4_ * fVar248 * 4.0;
        auVar41._12_4_ = auVar8._12_4_ * fVar250 * 4.0;
        auVar41._16_4_ = auVar8._16_4_ * fVar252 * 4.0;
        auVar41._20_4_ = auVar8._20_4_ * fVar254 * 4.0;
        auVar41._24_4_ = auVar8._24_4_ * fVar255 * 4.0;
        auVar41._28_4_ = auVar98._28_4_;
        auVar282 = vsubps_avx(auVar30,auVar41);
        _local_b20 = vcmpps_avx(auVar282,ZEXT832(0) << 0x20,5);
        auVar98 = _local_b20;
        if ((((((((_local_b20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_b20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_b20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_b20 >> 0x7f,0) == '\0') &&
              (_local_b20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_b20 >> 0xbf,0) == '\0') &&
            (_local_b20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_b20[0x1f]) {
          auVar150 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar225 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar270 = ZEXT864(0) << 0x20;
          auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar216 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar277 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar240._8_4_ = 0x7f800000;
          auVar240._0_8_ = 0x7f8000007f800000;
          auVar240._12_4_ = 0x7f800000;
          auVar240._16_4_ = 0x7f800000;
          auVar240._20_4_ = 0x7f800000;
          auVar240._24_4_ = 0x7f800000;
          auVar240._28_4_ = 0x7f800000;
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          _local_b20 = auVar16;
        }
        else {
          auVar104 = vrcpps_avx(local_380);
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = 0x3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar105._16_4_ = 0x3f800000;
          auVar105._20_4_ = 0x3f800000;
          auVar105._24_4_ = 0x3f800000;
          auVar105._28_4_ = 0x3f800000;
          auVar236 = vfnmadd213ps_fma(local_380,auVar104,auVar105);
          auVar236 = vfmadd132ps_fma(ZEXT1632(auVar236),auVar104,auVar104);
          auVar104 = vsqrtps_avx(auVar282);
          uVar76 = CONCAT44(local_3a0._4_4_,local_3a0._0_4_);
          auVar231._0_8_ = uVar76 ^ 0x8000000080000000;
          auVar231._8_4_ = -local_3a0._8_4_;
          auVar231._12_4_ = -local_3a0._12_4_;
          auVar231._16_4_ = -local_3a0._16_4_;
          auVar231._20_4_ = -local_3a0._20_4_;
          auVar231._24_4_ = -local_3a0._24_4_;
          auVar231._28_4_ = -local_3a0._28_4_;
          auVar216 = vsubps_avx(auVar231,auVar104);
          auVar104 = vsubps_avx(auVar104,local_3a0);
          fVar181 = auVar216._0_4_ * auVar236._0_4_;
          fVar198 = auVar216._4_4_ * auVar236._4_4_;
          auVar42._4_4_ = fVar198;
          auVar42._0_4_ = fVar181;
          fVar246 = auVar216._8_4_ * auVar236._8_4_;
          auVar42._8_4_ = fVar246;
          fVar248 = auVar216._12_4_ * auVar236._12_4_;
          auVar42._12_4_ = fVar248;
          fVar250 = auVar216._16_4_ * 0.0;
          auVar42._16_4_ = fVar250;
          fVar252 = auVar216._20_4_ * 0.0;
          auVar42._20_4_ = fVar252;
          fVar254 = auVar216._24_4_ * 0.0;
          auVar42._24_4_ = fVar254;
          auVar42._28_4_ = auVar216._28_4_;
          auVar274._0_4_ = auVar236._0_4_ * auVar104._0_4_;
          auVar274._4_4_ = auVar236._4_4_ * auVar104._4_4_;
          auVar274._8_4_ = auVar236._8_4_ * auVar104._8_4_;
          auVar274._12_4_ = auVar236._12_4_ * auVar104._12_4_;
          auVar274._16_4_ = auVar104._16_4_ * 0.0;
          auVar274._20_4_ = auVar104._20_4_ * 0.0;
          auVar274._24_4_ = auVar104._24_4_ * 0.0;
          auVar274._28_4_ = 0;
          auVar236 = vfmadd213ps_fma(local_2c0,auVar42,auVar193);
          auVar85 = vfmadd213ps_fma(local_2c0,auVar274,auVar193);
          auVar104 = ZEXT1632(CONCAT412(fVar180 * auVar236._12_4_,
                                        CONCAT48(fVar82 * auVar236._8_4_,
                                                 CONCAT44(fVar197 * auVar236._4_4_,
                                                          fVar196 * auVar236._0_4_))));
          auVar216 = ZEXT1632(CONCAT412(fVar180 * auVar85._12_4_,
                                        CONCAT48(fVar82 * auVar85._8_4_,
                                                 CONCAT44(fVar197 * auVar85._4_4_,
                                                          fVar196 * auVar85._0_4_))));
          auVar236 = vfmadd213ps_fma(local_260,auVar104,auVar100);
          auVar85 = vfmadd213ps_fma(local_260,auVar216,auVar100);
          auVar89 = vfmadd213ps_fma(local_280,auVar104,auVar283);
          auVar122 = vfmadd213ps_fma(local_280,auVar216,auVar283);
          auVar84 = vfmadd213ps_fma(auVar104,auVar12,auVar271);
          auVar123 = vfmadd213ps_fma(auVar12,auVar216,auVar271);
          auVar43._4_4_ = fVar198 * (float)local_980._4_4_;
          auVar43._0_4_ = fVar181 * (float)local_980._0_4_;
          auVar43._8_4_ = fVar246 * fStack_978;
          auVar43._12_4_ = fVar248 * fStack_974;
          auVar43._16_4_ = fVar250 * fStack_970;
          auVar43._20_4_ = fVar252 * fStack_96c;
          auVar43._24_4_ = fVar254 * fStack_968;
          auVar43._28_4_ = 0;
          auVar104 = vsubps_avx(auVar43,ZEXT1632(auVar236));
          auVar44._4_4_ = (float)local_860._4_4_ * fVar198;
          auVar44._0_4_ = (float)local_860._0_4_ * fVar181;
          auVar44._8_4_ = fStack_858 * fVar246;
          auVar44._12_4_ = fStack_854 * fVar248;
          auVar44._16_4_ = fStack_850 * fVar250;
          auVar44._20_4_ = fStack_84c * fVar252;
          auVar44._24_4_ = fStack_848 * fVar254;
          auVar44._28_4_ = 0;
          auVar216 = vsubps_avx(auVar44,ZEXT1632(auVar89));
          auVar151._0_4_ = (float)local_960._0_4_ * fVar181;
          auVar151._4_4_ = (float)local_960._4_4_ * fVar198;
          auVar151._8_4_ = fStack_958 * fVar246;
          auVar151._12_4_ = fStack_954 * fVar248;
          auVar151._16_4_ = fStack_950 * fVar250;
          auVar151._20_4_ = fStack_94c * fVar252;
          auVar151._24_4_ = fStack_948 * fVar254;
          auVar151._28_4_ = 0;
          auVar14 = vsubps_avx(auVar151,ZEXT1632(auVar84));
          auVar194._0_4_ = auVar274._0_4_ * (float)local_980._0_4_;
          auVar194._4_4_ = auVar274._4_4_ * (float)local_980._4_4_;
          auVar194._8_4_ = auVar274._8_4_ * fStack_978;
          auVar194._12_4_ = auVar274._12_4_ * fStack_974;
          auVar194._16_4_ = auVar274._16_4_ * fStack_970;
          auVar194._20_4_ = auVar274._20_4_ * fStack_96c;
          auVar194._24_4_ = auVar274._24_4_ * fStack_968;
          auVar194._28_4_ = 0;
          auVar150 = vsubps_avx(auVar194,ZEXT1632(auVar85));
          auVar45._4_4_ = (float)local_860._4_4_ * auVar274._4_4_;
          auVar45._0_4_ = (float)local_860._0_4_ * auVar274._0_4_;
          auVar45._8_4_ = fStack_858 * auVar274._8_4_;
          auVar45._12_4_ = fStack_854 * auVar274._12_4_;
          auVar45._16_4_ = fStack_850 * auVar274._16_4_;
          auVar45._20_4_ = fStack_84c * auVar274._20_4_;
          auVar45._24_4_ = fStack_848 * auVar274._24_4_;
          auVar45._28_4_ = 0;
          auVar225 = vsubps_avx(auVar45,ZEXT1632(auVar122));
          auVar46._4_4_ = (float)local_960._4_4_ * auVar274._4_4_;
          auVar46._0_4_ = (float)local_960._0_4_ * auVar274._0_4_;
          auVar46._8_4_ = fStack_958 * auVar274._8_4_;
          auVar46._12_4_ = fStack_954 * auVar274._12_4_;
          auVar46._16_4_ = fStack_950 * auVar274._16_4_;
          auVar46._20_4_ = fStack_94c * auVar274._20_4_;
          auVar46._24_4_ = fStack_948 * auVar274._24_4_;
          auVar46._28_4_ = uStack_844;
          auVar12 = vsubps_avx(auVar46,ZEXT1632(auVar123));
          auVar270 = ZEXT3264(auVar12);
          auVar282 = vcmpps_avx(auVar282,_DAT_01f7b000,5);
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar240 = vblendvps_avx(auVar241,auVar42,auVar282);
          auVar12 = vandps_avx(local_880,local_2a0);
          auVar12 = vmaxps_avx(local_720,auVar12);
          auVar47._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar47._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar47._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar47._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar47._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar47._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar47._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar47._28_4_ = auVar12._28_4_;
          auVar12 = vandps_avx(local_880,auVar13);
          auVar12 = vcmpps_avx(auVar12,auVar47,1);
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
          auVar265 = vblendvps_avx(auVar266,auVar274,auVar282);
          auVar13 = auVar282 & auVar12;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar98 = vandps_avx(auVar12,auVar282);
            auVar12 = vcmpps_avx(auVar8,_DAT_01f7b000,2);
            auVar209._8_4_ = 0xff800000;
            auVar209._0_8_ = 0xff800000ff800000;
            auVar209._12_4_ = 0xff800000;
            auVar209._16_4_ = 0xff800000;
            auVar209._20_4_ = 0xff800000;
            auVar209._24_4_ = 0xff800000;
            auVar209._28_4_ = 0xff800000;
            auVar217._8_4_ = 0x7f800000;
            auVar217._0_8_ = 0x7f8000007f800000;
            auVar217._12_4_ = 0x7f800000;
            auVar217._16_4_ = 0x7f800000;
            auVar217._20_4_ = 0x7f800000;
            auVar217._24_4_ = 0x7f800000;
            auVar217._28_4_ = 0x7f800000;
            auVar8 = vblendvps_avx(auVar217,auVar209,auVar12);
            auVar236 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar236);
            auVar240 = vblendvps_avx(auVar240,auVar8,auVar13);
            auVar8 = vblendvps_avx(auVar209,auVar217,auVar12);
            auVar265 = vblendvps_avx(auVar265,auVar8,auVar13);
            auVar232._0_8_ = auVar98._0_8_ ^ 0xffffffffffffffff;
            auVar232._8_4_ = auVar98._8_4_ ^ 0xffffffff;
            auVar232._12_4_ = auVar98._12_4_ ^ 0xffffffff;
            auVar232._16_4_ = auVar98._16_4_ ^ 0xffffffff;
            auVar232._20_4_ = auVar98._20_4_ ^ 0xffffffff;
            auVar232._24_4_ = auVar98._24_4_ ^ 0xffffffff;
            auVar232._28_4_ = auVar98._28_4_ ^ 0xffffffff;
            auVar98 = vorps_avx(auVar232,auVar12);
            auVar98 = vandps_avx(auVar282,auVar98);
          }
          auVar277 = auVar14._0_28_;
          local_b80 = auVar128;
        }
        local_540 = local_a80;
        local_520 = vminps_avx(local_3c0,auVar240);
        _local_9a0 = vmaxps_avx(local_a80,auVar265);
        _local_3e0 = _local_9a0;
        auVar8 = vcmpps_avx(local_a80,local_520,2);
        local_7c0 = vandps_avx(auVar8,auVar128);
        auVar8 = vcmpps_avx(_local_9a0,local_3c0,2);
        local_9c0 = vandps_avx(auVar8,auVar128);
        auVar128 = vorps_avx(local_7c0,local_9c0);
        auVar210 = ZEXT3264(_local_960);
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0x7f,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar128 >> 0xbf,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar128[0x1f] < '\0') {
          auStack_9f8 = auVar30._8_24_;
          auVar48._4_4_ = auVar270._4_4_ * (float)local_960._4_4_;
          auVar48._0_4_ = auVar270._0_4_ * (float)local_960._0_4_;
          auVar48._8_4_ = auVar270._8_4_ * fStack_958;
          auVar48._12_4_ = auVar270._12_4_ * fStack_954;
          auVar48._16_4_ = auVar270._16_4_ * fStack_950;
          auVar48._20_4_ = auVar270._20_4_ * fStack_94c;
          auVar48._24_4_ = auVar270._24_4_ * fStack_948;
          auVar48._28_4_ = auVar128._28_4_;
          auVar243 = ZEXT3264(_local_960);
          auVar236 = vfmadd213ps_fma(auVar225,_local_860,auVar48);
          auVar226 = ZEXT3264(_local_980);
          auVar236 = vfmadd213ps_fma(auVar150,_local_980,ZEXT1632(auVar236));
          auVar178._0_8_ = auVar98._0_8_ ^ 0xffffffffffffffff;
          auVar178._8_4_ = auVar98._8_4_ ^ 0xffffffff;
          auVar178._12_4_ = auVar98._12_4_ ^ 0xffffffff;
          auVar178._16_4_ = auVar98._16_4_ ^ 0xffffffff;
          auVar178._20_4_ = auVar98._20_4_ ^ 0xffffffff;
          auVar178._24_4_ = auVar98._24_4_ ^ 0xffffffff;
          auVar178._28_4_ = auVar98._28_4_ ^ 0xffffffff;
          auVar267 = ZEXT3264(local_880);
          auVar98 = vandps_avx(local_880,ZEXT1632(auVar236));
          auVar208._8_4_ = 0x3e99999a;
          auVar208._0_8_ = 0x3e99999a3e99999a;
          auVar208._12_4_ = 0x3e99999a;
          auVar208._16_4_ = 0x3e99999a;
          auVar208._20_4_ = 0x3e99999a;
          auVar208._24_4_ = 0x3e99999a;
          auVar208._28_4_ = 0x3e99999a;
          auVar210 = ZEXT3264(auVar208);
          auVar98 = vcmpps_avx(auVar98,auVar208,1);
          local_800 = vorps_avx(auVar98,auVar178);
          auVar153._0_4_ = (float)local_960._0_4_ * auVar277._0_4_;
          auVar153._4_4_ = (float)local_960._4_4_ * auVar277._4_4_;
          auVar153._8_4_ = fStack_958 * auVar277._8_4_;
          auVar153._12_4_ = fStack_954 * auVar277._12_4_;
          auVar153._16_4_ = fStack_950 * auVar277._16_4_;
          auVar153._20_4_ = fStack_94c * auVar277._20_4_;
          auVar153._24_4_ = fStack_948 * auVar277._24_4_;
          auVar153._28_4_ = 0;
          auVar236 = vfmadd213ps_fma(auVar216,_local_860,auVar153);
          auVar236 = vfmadd213ps_fma(auVar104,_local_980,ZEXT1632(auVar236));
          auVar98 = vandps_avx(local_880,ZEXT1632(auVar236));
          auVar98 = vcmpps_avx(auVar98,auVar208,1);
          auVar98 = vorps_avx(auVar98,auVar178);
          auVar131._8_4_ = 3;
          auVar131._0_8_ = 0x300000003;
          auVar131._12_4_ = 3;
          auVar131._16_4_ = 3;
          auVar131._20_4_ = 3;
          auVar131._24_4_ = 3;
          auVar131._28_4_ = 3;
          auVar154._8_4_ = 2;
          auVar154._0_8_ = 0x200000002;
          auVar154._12_4_ = 2;
          auVar154._16_4_ = 2;
          auVar154._20_4_ = 2;
          auVar154._24_4_ = 2;
          auVar154._28_4_ = 2;
          auVar98 = vblendvps_avx(auVar154,auVar131,auVar98);
          local_820._4_4_ = local_cc4;
          local_820._0_4_ = local_cc4;
          local_820._8_4_ = local_cc4;
          local_820._12_4_ = local_cc4;
          local_820._16_4_ = local_cc4;
          local_820._20_4_ = local_cc4;
          local_820._24_4_ = local_cc4;
          local_820._28_4_ = local_cc4;
          local_7e0 = vpcmpgtd_avx2(auVar98,local_820);
          local_560 = vpandn_avx2(local_7e0,local_7c0);
          local_9e0._4_4_ = local_a80._4_4_ + (float)local_a60._4_4_;
          local_9e0._0_4_ = local_a80._0_4_ + (float)local_a60._0_4_;
          fStack_9d8 = local_a80._8_4_ + fStack_a58;
          fStack_9d4 = local_a80._12_4_ + fStack_a54;
          fStack_9d0 = local_a80._16_4_ + fStack_a50;
          fStack_9cc = local_a80._20_4_ + fStack_a4c;
          fStack_9c8 = local_a80._24_4_ + fStack_a48;
          fStack_9c4 = local_a80._28_4_ + fStack_a44;
          while( true ) {
            fStack_bec = auVar10._4_4_;
            fStack_be8 = auVar10._8_4_;
            fStack_be4 = auVar10._12_4_;
            if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_560 >> 0x7f,0) == '\0') &&
                  (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_560 >> 0xbf,0) == '\0') &&
                (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_560[0x1f]) break;
            auVar132._8_4_ = 0x7f800000;
            auVar132._0_8_ = 0x7f8000007f800000;
            auVar132._12_4_ = 0x7f800000;
            auVar132._16_4_ = 0x7f800000;
            auVar132._20_4_ = 0x7f800000;
            auVar132._24_4_ = 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar132,local_a80,local_560);
            auVar128 = vshufps_avx(auVar98,auVar98,0xb1);
            auVar128 = vminps_avx(auVar98,auVar128);
            auVar8 = vshufpd_avx(auVar128,auVar128,5);
            auVar128 = vminps_avx(auVar128,auVar8);
            auVar8 = vpermpd_avx2(auVar128,0x4e);
            auVar128 = vminps_avx(auVar128,auVar8);
            auVar128 = vcmpps_avx(auVar98,auVar128,0);
            auVar8 = local_560 & auVar128;
            auVar98 = local_560;
            if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0x7f,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar8 >> 0xbf,0) != '\0') ||
                (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar8[0x1f] < '\0') {
              auVar98 = vandps_avx(auVar128,local_560);
            }
            uVar71 = vmovmskps_avx(auVar98);
            iVar70 = 0;
            for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar70 = iVar70 + 1;
            }
            uVar74 = iVar70 << 2;
            *(undefined4 *)(local_560 + uVar74) = 0;
            uVar71 = *(uint *)(local_1a0 + uVar74);
            uVar74 = *(uint *)(local_540 + uVar74);
            fVar181 = auVar6._0_4_;
            if ((float)local_aa0._0_4_ < 0.0) {
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar270 = ZEXT1664(auVar270._0_16_);
              fVar181 = sqrtf((float)local_aa0._0_4_);
            }
            auVar226 = ZEXT464(uVar74);
            auVar85 = vminps_avx(auVar11,auVar86);
            auVar236 = vmaxps_avx(auVar11,auVar86);
            auVar210 = ZEXT1664(auVar10);
            auVar89 = vminps_avx(auVar9,auVar10);
            auVar122 = vminps_avx(auVar85,auVar89);
            auVar85 = vmaxps_avx(auVar9,auVar10);
            auVar89 = vmaxps_avx(auVar236,auVar85);
            auVar236 = vandps_avx(auVar122,auVar228);
            auVar85 = vandps_avx(auVar89,auVar228);
            auVar236 = vmaxps_avx(auVar236,auVar85);
            auVar85 = vmovshdup_avx(auVar236);
            auVar85 = vmaxss_avx(auVar85,auVar236);
            auVar236 = vshufpd_avx(auVar236,auVar236,1);
            auVar236 = vmaxss_avx(auVar236,auVar85);
            local_b80._0_4_ = auVar236._0_4_ * 1.9073486e-06;
            local_8c0._0_4_ = fVar181 * 1.9073486e-06;
            local_940._0_16_ = vshufps_avx(auVar89,auVar89,0xff);
            auVar236 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar71),0x10);
            auVar243 = ZEXT1664(auVar236);
            lVar73 = 5;
            do {
              do {
                auVar236 = auVar243._0_16_;
                bVar79 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                if (bVar79) goto LAB_011b704f;
                local_b40._0_16_ = vmovshdup_avx(auVar236);
                fVar246 = local_b40._0_4_;
                fVar82 = 1.0 - fVar246;
                fVar198 = fVar82 * fVar82 * fVar82;
                fVar197 = fVar246 * fVar246 * fVar246;
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar198),
                                          ZEXT416((uint)fVar197));
                fVar181 = fVar246 * fVar82;
                auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar181 * 6.0)),
                                           ZEXT416((uint)(fVar82 * fVar181)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * fVar181 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar246 * fVar181)));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar197),
                                          ZEXT416((uint)fVar198));
                fVar196 = (auVar85._0_4_ + auVar84._0_4_) * 0.16666667;
                fVar197 = fVar197 * 0.16666667;
                auVar124._0_4_ = fVar197 * fVar114;
                auVar124._4_4_ = fVar197 * fStack_bec;
                auVar124._8_4_ = fVar197 * fStack_be8;
                auVar124._12_4_ = fVar197 * fStack_be4;
                auVar159._4_4_ = fVar196;
                auVar159._0_4_ = fVar196;
                auVar159._8_4_ = fVar196;
                auVar159._12_4_ = fVar196;
                auVar85 = vfmadd132ps_fma(auVar159,auVar124,auVar9);
                fVar196 = (auVar89._0_4_ + auVar122._0_4_) * 0.16666667;
                auVar125._4_4_ = fVar196;
                auVar125._0_4_ = fVar196;
                auVar125._8_4_ = fVar196;
                auVar125._12_4_ = fVar196;
                auVar85 = vfmadd132ps_fma(auVar125,auVar85,auVar86);
                fVar197 = auVar243._0_4_;
                auVar139._4_4_ = fVar197;
                auVar139._0_4_ = fVar197;
                auVar139._8_4_ = fVar197;
                auVar139._12_4_ = fVar197;
                auVar89 = vfmadd213ps_fma(auVar139,local_a90,_DAT_01f45a50);
                fVar198 = fVar198 * 0.16666667;
                auVar88._4_4_ = fVar198;
                auVar88._0_4_ = fVar198;
                auVar88._8_4_ = fVar198;
                auVar88._12_4_ = fVar198;
                auVar85 = vfmadd132ps_fma(auVar88,auVar85,auVar11);
                local_8a0._0_16_ = auVar85;
                auVar85 = vsubps_avx(auVar89,auVar85);
                _local_b20 = auVar85;
                auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
                fVar196 = auVar85._0_4_;
                if (fVar196 < 0.0) {
                  local_b60._0_16_ = ZEXT416((uint)fVar82);
                  auVar210._0_4_ = sqrtf(fVar196);
                  auVar210._4_60_ = extraout_var;
                  auVar89 = auVar210._0_16_;
                  auVar122 = local_b60._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar85,auVar85);
                  auVar122 = ZEXT416((uint)fVar82);
                }
                fVar198 = auVar122._0_4_;
                auVar90._4_4_ = fVar198;
                auVar90._0_4_ = fVar198;
                auVar90._8_4_ = fVar198;
                auVar90._12_4_ = fVar198;
                auVar123 = vfnmsub213ss_fma(local_b40._0_16_,local_b40._0_16_,
                                            ZEXT416((uint)(fVar181 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * 4.0)),auVar122,auVar122);
                fVar181 = fVar198 * -fVar198 * 0.5;
                fVar198 = auVar123._0_4_ * 0.5;
                fVar82 = auVar84._0_4_ * 0.5;
                fVar246 = fVar246 * fVar246 * 0.5;
                auVar203._0_4_ = fVar114 * fVar246;
                auVar203._4_4_ = fStack_bec * fVar246;
                auVar203._8_4_ = fStack_be8 * fVar246;
                auVar203._12_4_ = fStack_be4 * fVar246;
                auVar160._4_4_ = fVar82;
                auVar160._0_4_ = fVar82;
                auVar160._8_4_ = fVar82;
                auVar160._12_4_ = fVar82;
                auVar84 = vfmadd213ps_fma(auVar160,auVar9,auVar203);
                auVar183._4_4_ = fVar198;
                auVar183._0_4_ = fVar198;
                auVar183._8_4_ = fVar198;
                auVar183._12_4_ = fVar198;
                auVar84 = vfmadd213ps_fma(auVar183,auVar86,auVar84);
                auVar258._4_4_ = fVar181;
                auVar258._0_4_ = fVar181;
                auVar258._8_4_ = fVar181;
                auVar258._12_4_ = fVar181;
                auVar158 = vfmadd213ps_fma(auVar258,auVar11,auVar84);
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar122,local_b40._0_16_);
                auVar123 = vfmadd213ss_fma(local_b40._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar122)
                ;
                auVar122 = vshufps_avx(auVar236,auVar236,0x55);
                auVar161._0_4_ = fVar114 * auVar122._0_4_;
                auVar161._4_4_ = fStack_bec * auVar122._4_4_;
                auVar161._8_4_ = fStack_be8 * auVar122._8_4_;
                auVar161._12_4_ = fStack_be4 * auVar122._12_4_;
                uVar77 = auVar123._0_4_;
                auVar184._4_4_ = uVar77;
                auVar184._0_4_ = uVar77;
                auVar184._8_4_ = uVar77;
                auVar184._12_4_ = uVar77;
                auVar122 = vfmadd213ps_fma(auVar184,auVar9,auVar161);
                auVar140._0_4_ = auVar84._0_4_;
                auVar140._4_4_ = auVar140._0_4_;
                auVar140._8_4_ = auVar140._0_4_;
                auVar140._12_4_ = auVar140._0_4_;
                auVar122 = vfmadd213ps_fma(auVar140,auVar86,auVar122);
                auVar142 = vfmadd231ps_fma(auVar122,auVar11,auVar90);
                auVar84 = vdpps_avx(auVar158,auVar158,0x7f);
                auVar122 = vblendps_avx(auVar84,_DAT_01f45a50,0xe);
                auVar123 = vrsqrtss_avx(auVar122,auVar122);
                fVar181 = auVar123._0_4_;
                fVar82 = auVar84._0_4_;
                fVar181 = fVar181 * 1.5 + fVar82 * -0.5 * fVar181 * fVar181 * fVar181;
                auVar123 = vdpps_avx(auVar158,auVar142,0x7f);
                auVar141._0_4_ = auVar142._0_4_ * fVar82;
                auVar141._4_4_ = auVar142._4_4_ * fVar82;
                auVar141._8_4_ = auVar142._8_4_ * fVar82;
                auVar141._12_4_ = auVar142._12_4_ * fVar82;
                fVar198 = auVar123._0_4_;
                auVar204._0_4_ = auVar158._0_4_ * fVar198;
                auVar204._4_4_ = auVar158._4_4_ * fVar198;
                fVar246 = auVar158._8_4_;
                auVar204._8_4_ = fVar246 * fVar198;
                fVar180 = auVar158._12_4_;
                auVar204._12_4_ = fVar180 * fVar198;
                auVar123 = vsubps_avx(auVar141,auVar204);
                auVar122 = vrcpss_avx(auVar122,auVar122);
                auVar142 = vfnmadd213ss_fma(auVar122,auVar84,ZEXT416(0x40000000));
                fVar198 = auVar122._0_4_ * auVar142._0_4_;
                auVar122 = vmaxss_avx(ZEXT416((uint)local_b80._0_4_),
                                      ZEXT416((uint)(fVar197 * (float)local_8c0._0_4_)));
                auVar137 = ZEXT1664(auVar122);
                auVar220._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
                auVar220._8_4_ = -fVar246;
                auVar220._12_4_ = -fVar180;
                auVar162._0_4_ = fVar181 * auVar123._0_4_ * fVar198;
                auVar162._4_4_ = fVar181 * auVar123._4_4_ * fVar198;
                auVar162._8_4_ = fVar181 * auVar123._8_4_ * fVar198;
                auVar162._12_4_ = fVar181 * auVar123._12_4_ * fVar198;
                auVar237._0_4_ = auVar158._0_4_ * fVar181;
                auVar237._4_4_ = auVar158._4_4_ * fVar181;
                auVar237._8_4_ = fVar246 * fVar181;
                auVar237._12_4_ = fVar180 * fVar181;
                local_b40._0_16_ = auVar158;
                local_b60._0_4_ = auVar122._0_4_;
                if (fVar82 < -fVar82) {
                  local_ac0._0_16_ = auVar237;
                  local_ae0._0_16_ = auVar162;
                  fVar181 = sqrtf(fVar82);
                  auVar137 = ZEXT464((uint)local_b60._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar162 = local_ae0._0_16_;
                  auVar237 = local_ac0._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar84,auVar84);
                  fVar181 = auVar122._0_4_;
                }
                auVar122 = vdpps_avx(_local_b20,auVar237,0x7f);
                auVar142 = vfmadd213ss_fma(ZEXT416((uint)local_b80._0_4_),auVar89,auVar137._0_16_);
                auVar84 = vdpps_avx(auVar220,auVar237,0x7f);
                auVar123 = vdpps_avx(_local_b20,auVar162,0x7f);
                auVar158 = vdpps_avx(local_a90,auVar237,0x7f);
                auVar142 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_b80._0_4_ / fVar181)),
                                           auVar142);
                auVar267 = ZEXT1664(auVar142);
                fVar181 = auVar84._0_4_ + auVar123._0_4_;
                auVar270 = ZEXT464((uint)fVar181);
                fVar198 = auVar122._0_4_;
                auVar91._0_4_ = fVar198 * fVar198;
                auVar91._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                auVar91._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                auVar91._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                auVar89 = vdpps_avx(_local_b20,auVar220,0x7f);
                auVar123 = vsubps_avx(auVar85,auVar91);
                auVar84 = vrsqrtss_avx(auVar123,auVar123);
                fVar82 = auVar123._0_4_;
                fVar197 = auVar84._0_4_;
                fVar197 = fVar197 * 1.5 + fVar82 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar84 = vdpps_avx(_local_b20,local_a90,0x7f);
                auVar89 = vfnmadd231ss_fma(auVar89,auVar122,ZEXT416((uint)fVar181));
                auVar84 = vfnmadd231ss_fma(auVar84,auVar122,auVar158);
                if (fVar82 < 0.0) {
                  local_ac0._0_16_ = ZEXT416((uint)fVar181);
                  local_ae0._0_16_ = auVar158;
                  local_8e0._0_16_ = auVar89;
                  local_900._0_4_ = fVar197;
                  local_920._0_16_ = auVar84;
                  fVar181 = sqrtf(fVar82);
                  auVar270 = ZEXT1664(local_ac0._0_16_);
                  auVar267 = ZEXT464(auVar142._0_4_);
                  auVar137 = ZEXT464((uint)local_b60._0_4_);
                  fVar197 = (float)local_900._0_4_;
                  auVar84 = local_920._0_16_;
                  auVar158 = local_ae0._0_16_;
                  auVar89 = local_8e0._0_16_;
                }
                else {
                  auVar123 = vsqrtss_avx(auVar123,auVar123);
                  fVar181 = auVar123._0_4_;
                }
                auVar226 = ZEXT1664(local_b40._0_16_);
                auVar123 = vpermilps_avx(local_8a0._0_16_,0xff);
                fVar181 = fVar181 - auVar123._0_4_;
                auVar123 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xff);
                auVar89 = vfmsub213ss_fma(auVar89,ZEXT416((uint)fVar197),auVar123);
                auVar163._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
                auVar163._8_4_ = auVar158._8_4_ ^ 0x80000000;
                auVar163._12_4_ = auVar158._12_4_ ^ 0x80000000;
                auVar185._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar142 = ZEXT416((uint)(auVar84._0_4_ * fVar197));
                auVar83 = auVar270._0_16_;
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar158._0_4_ * auVar89._0_4_)),auVar83,
                                          auVar142);
                auVar210 = ZEXT1664(auVar84);
                auVar89 = vinsertps_avx(auVar185,auVar142,0x1c);
                uVar77 = auVar84._0_4_;
                auVar186._4_4_ = uVar77;
                auVar186._0_4_ = uVar77;
                auVar186._8_4_ = uVar77;
                auVar186._12_4_ = uVar77;
                auVar89 = vdivps_avx(auVar89,auVar186);
                auVar84 = vinsertps_avx(auVar83,auVar163,0x10);
                auVar84 = vdivps_avx(auVar84,auVar186);
                auVar143._0_4_ = fVar198 * auVar89._0_4_ + fVar181 * auVar84._0_4_;
                auVar143._4_4_ = fVar198 * auVar89._4_4_ + fVar181 * auVar84._4_4_;
                auVar143._8_4_ = fVar198 * auVar89._8_4_ + fVar181 * auVar84._8_4_;
                auVar143._12_4_ = fVar198 * auVar89._12_4_ + fVar181 * auVar84._12_4_;
                auVar89 = vsubps_avx(auVar236,auVar143);
                auVar243 = ZEXT1664(auVar89);
                auVar236 = vandps_avx(auVar122,auVar228);
              } while (auVar267._0_4_ <= auVar236._0_4_);
              auVar122 = vfmadd231ss_fma(ZEXT416((uint)(auVar137._0_4_ + auVar267._0_4_)),
                                         local_940._0_16_,ZEXT416(0x36000000));
              auVar236 = vandps_avx(ZEXT416((uint)fVar181),auVar228);
            } while (auVar122._0_4_ <= auVar236._0_4_);
            fVar181 = auVar89._0_4_ + (float)local_a20._0_4_;
            if ((fVar80 <= fVar181) &&
               (fVar197 = *(float *)(ray + k * 4 + 0x100), fVar181 <= fVar197)) {
              auVar236 = vmovshdup_avx(auVar89);
              fVar198 = auVar236._0_4_;
              if ((0.0 <= fVar198) && (fVar198 <= 1.0)) {
                auVar85 = vrsqrtss_avx(auVar85,auVar85);
                fVar82 = auVar85._0_4_;
                auVar210 = ZEXT464((uint)(fVar196 * -0.5));
                pGVar3 = (context->scene->geometries).items[uVar72].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar196 = fVar82 * 1.5 + fVar196 * -0.5 * fVar82 * fVar82 * fVar82;
                  auVar164._0_4_ = fVar196 * (float)local_b20._0_4_;
                  auVar164._4_4_ = fVar196 * (float)local_b20._4_4_;
                  auVar164._8_4_ = fVar196 * fStack_b18;
                  auVar164._12_4_ = fVar196 * fStack_b14;
                  auVar123 = vfmadd213ps_fma(auVar123,auVar164,local_b40._0_16_);
                  auVar85 = vshufps_avx(auVar164,auVar164,0xc9);
                  auVar122 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xc9);
                  auVar165._0_4_ = auVar164._0_4_ * auVar122._0_4_;
                  auVar165._4_4_ = auVar164._4_4_ * auVar122._4_4_;
                  auVar165._8_4_ = auVar164._8_4_ * auVar122._8_4_;
                  auVar165._12_4_ = auVar164._12_4_ * auVar122._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar165,local_b40._0_16_,auVar85);
                  auVar85 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar122 = vshufps_avx(auVar123,auVar123,0xc9);
                  auVar210 = ZEXT1664(auVar122);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar92._0_4_ = auVar123._0_4_ * auVar84._0_4_;
                  auVar92._4_4_ = auVar123._4_4_ * auVar84._4_4_;
                  auVar92._8_4_ = auVar123._8_4_ * auVar84._8_4_;
                  auVar92._12_4_ = auVar123._12_4_ * auVar84._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar92,auVar85,auVar122);
                  uVar77 = auVar85._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar181;
                    uVar2 = vextractps_avx(auVar85,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar2;
                    uVar2 = vextractps_avx(auVar85,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar77;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar198;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_a00;
                    *(uint *)(ray + k * 4 + 0x240) = uVar72;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar5 = context->user;
                    local_4a0 = auVar236._0_8_;
                    auVar236 = vmovshdup_avx(auVar85);
                    local_500._8_8_ = auVar236._0_8_;
                    auVar236 = vshufps_avx(auVar85,auVar85,0xaa);
                    local_4e0 = auVar236._0_8_;
                    local_500._0_8_ = local_500._8_8_;
                    local_500._16_8_ = local_500._8_8_;
                    local_500._24_8_ = local_500._8_8_;
                    uStack_4d8 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4c8 = local_4e0;
                    local_4c0 = uVar77;
                    uStack_4bc = uVar77;
                    uStack_4b8 = uVar77;
                    uStack_4b4 = uVar77;
                    uStack_4b0 = uVar77;
                    uStack_4ac = uVar77;
                    uStack_4a8 = uVar77;
                    uStack_4a4 = uVar77;
                    uStack_498 = local_4a0;
                    uStack_490 = local_4a0;
                    uStack_488 = local_4a0;
                    auVar144._12_4_ = 0;
                    auVar144._0_12_ = ZEXT812(0);
                    auVar144 = auVar144 << 0x20;
                    local_480 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_460 = CONCAT44(uStack_75c,local_760);
                    uStack_458 = CONCAT44(uStack_754,uStack_758);
                    uStack_450 = CONCAT44(uStack_74c,uStack_750);
                    uStack_448 = CONCAT44(uStack_744,uStack_748);
                    local_440._4_4_ = uStack_73c;
                    local_440._0_4_ = local_740;
                    local_440._8_4_ = uStack_738;
                    local_440._12_4_ = uStack_734;
                    local_440._16_4_ = uStack_730;
                    local_440._20_4_ = uStack_72c;
                    local_440._24_4_ = uStack_728;
                    local_440._28_4_ = uStack_724;
                    auVar98 = vpcmpeqd_avx2(local_440,local_440);
                    local_ae8[1] = auVar98;
                    *local_ae8 = auVar98;
                    local_420 = pRVar5->instID[0];
                    uStack_41c = local_420;
                    uStack_418 = local_420;
                    uStack_414 = local_420;
                    uStack_410 = local_420;
                    uStack_40c = local_420;
                    uStack_408 = local_420;
                    uStack_404 = local_420;
                    local_400 = pRVar5->instPrimID[0];
                    uStack_3fc = local_400;
                    uStack_3f8 = local_400;
                    uStack_3f4 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3ec = local_400;
                    uStack_3e8 = local_400;
                    uStack_3e4 = local_400;
                    *(float *)(ray + k * 4 + 0x100) = fVar181;
                    local_a40 = local_780;
                    local_bb0.valid = (int *)local_a40;
                    local_bb0.geometryUserPtr = pGVar3->userPtr;
                    local_bb0.context = context->user;
                    local_bb0.hit = (RTCHitN *)local_500;
                    local_bb0.N = 8;
                    local_bb0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar210 = ZEXT1664(auVar122);
                      auVar226 = ZEXT1664(local_b40._0_16_);
                      auVar243 = ZEXT1664(auVar89);
                      auVar267 = ZEXT1664(auVar267._0_16_);
                      auVar270 = ZEXT1664(auVar83);
                      (*pGVar3->intersectionFilterN)(&local_bb0);
                      auVar144 = ZEXT816(0) << 0x40;
                    }
                    auVar128 = ZEXT1632(auVar144);
                    auVar98 = vpcmpeqd_avx2(local_a40,auVar128);
                    auVar98 = _DAT_01f7b020 & ~auVar98;
                    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0x7f,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar98 >> 0xbf,0) != '\0') ||
                        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar98[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        auVar226 = ZEXT1664(auVar226._0_16_);
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar270 = ZEXT1664(auVar270._0_16_);
                        (*p_Var4)(&local_bb0);
                        auVar128 = ZEXT832(0) << 0x40;
                      }
                      auVar128 = vpcmpeqd_avx2(local_a40,auVar128);
                      auVar98 = _DAT_01f7b020 & ~auVar128;
                      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar98 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar98 >> 0x7f,0) != '\0') ||
                            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0xbf,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar98[0x1f] < '\0') {
                        auVar108._0_8_ = auVar128._0_8_ ^ 0xffffffffffffffff;
                        auVar108._8_4_ = auVar128._8_4_ ^ 0xffffffff;
                        auVar108._12_4_ = auVar128._12_4_ ^ 0xffffffff;
                        auVar108._16_4_ = auVar128._16_4_ ^ 0xffffffff;
                        auVar108._20_4_ = auVar128._20_4_ ^ 0xffffffff;
                        auVar108._24_4_ = auVar128._24_4_ ^ 0xffffffff;
                        auVar108._28_4_ = auVar128._28_4_ ^ 0xffffffff;
                        auVar98 = vmaskmovps_avx(auVar108,*(undefined1 (*) [32])local_bb0.hit);
                        *(undefined1 (*) [32])(local_bb0.ray + 0x180) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar108,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1a0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar108,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1c0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar108,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1e0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar108,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x200) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar108,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x220) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar108,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x240) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar108,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x260) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar108,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x280) = auVar98;
                        goto LAB_011b704f;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar197;
                  }
                }
              }
            }
LAB_011b704f:
            uVar77 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar260._4_4_ = uVar77;
            auVar260._0_4_ = uVar77;
            auVar260._8_4_ = uVar77;
            auVar260._12_4_ = uVar77;
            auVar260._16_4_ = uVar77;
            auVar260._20_4_ = uVar77;
            auVar260._24_4_ = uVar77;
            auVar260._28_4_ = uVar77;
            auVar137 = ZEXT3264(auVar260);
            auVar98 = vcmpps_avx(_local_9e0,auVar260,2);
            local_560 = vandps_avx(auVar98,local_560);
          }
          auVar109._0_4_ = (float)local_a60._0_4_ + (float)local_9a0._0_4_;
          auVar109._4_4_ = (float)local_a60._4_4_ + (float)local_9a0._4_4_;
          auVar109._8_4_ = fStack_a58 + fStack_998;
          auVar109._12_4_ = fStack_a54 + fStack_994;
          auVar109._16_4_ = fStack_a50 + fStack_990;
          auVar109._20_4_ = fStack_a4c + fStack_98c;
          auVar109._24_4_ = fStack_a48 + fStack_988;
          auVar109._28_4_ = fStack_a44 + fStack_984;
          uVar77 = auVar137._0_4_;
          auVar133._4_4_ = uVar77;
          auVar133._0_4_ = uVar77;
          auVar133._8_4_ = uVar77;
          auVar133._12_4_ = uVar77;
          auVar133._16_4_ = uVar77;
          auVar133._20_4_ = uVar77;
          auVar133._24_4_ = uVar77;
          auVar133._28_4_ = uVar77;
          auVar98 = vcmpps_avx(auVar109,auVar133,2);
          local_9c0 = vandps_avx(auVar98,local_9c0);
          auVar110._8_4_ = 3;
          auVar110._0_8_ = 0x300000003;
          auVar110._12_4_ = 3;
          auVar110._16_4_ = 3;
          auVar110._20_4_ = 3;
          auVar110._24_4_ = 3;
          auVar110._28_4_ = 3;
          auVar134._8_4_ = 2;
          auVar134._0_8_ = 0x200000002;
          auVar134._12_4_ = 2;
          auVar134._16_4_ = 2;
          auVar134._20_4_ = 2;
          auVar134._24_4_ = 2;
          auVar134._28_4_ = 2;
          auVar98 = vblendvps_avx(auVar134,auVar110,local_800);
          _local_9e0 = vpcmpgtd_avx2(auVar98,local_820);
          local_580 = vpandn_avx2(_local_9e0,local_9c0);
          local_a80 = _local_3e0;
          local_9a0._4_4_ = (float)local_a60._4_4_ + (float)local_3e0._4_4_;
          local_9a0._0_4_ = (float)local_a60._0_4_ + (float)local_3e0._0_4_;
          fStack_998 = fStack_a58 + fStack_3d8;
          fStack_994 = fStack_a54 + fStack_3d4;
          fStack_990 = fStack_a50 + fStack_3d0;
          fStack_98c = fStack_a4c + fStack_3cc;
          fStack_988 = fStack_a48 + fStack_3c8;
          fStack_984 = fStack_a44 + fStack_3c4;
          while( true ) {
            if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_580 >> 0x7f,0) == '\0') &&
                  (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_580 >> 0xbf,0) == '\0') &&
                (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_580[0x1f]) break;
            auVar135._8_4_ = 0x7f800000;
            auVar135._0_8_ = 0x7f8000007f800000;
            auVar135._12_4_ = 0x7f800000;
            auVar135._16_4_ = 0x7f800000;
            auVar135._20_4_ = 0x7f800000;
            auVar135._24_4_ = 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar135,local_a80,local_580);
            auVar128 = vshufps_avx(auVar98,auVar98,0xb1);
            auVar128 = vminps_avx(auVar98,auVar128);
            auVar8 = vshufpd_avx(auVar128,auVar128,5);
            auVar128 = vminps_avx(auVar128,auVar8);
            auVar8 = vpermpd_avx2(auVar128,0x4e);
            auVar128 = vminps_avx(auVar128,auVar8);
            auVar128 = vcmpps_avx(auVar98,auVar128,0);
            auVar8 = local_580 & auVar128;
            auVar98 = local_580;
            if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0x7f,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar8 >> 0xbf,0) != '\0') ||
                (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar8[0x1f] < '\0') {
              auVar98 = vandps_avx(auVar128,local_580);
            }
            uVar71 = vmovmskps_avx(auVar98);
            iVar70 = 0;
            for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar70 = iVar70 + 1;
            }
            uVar74 = iVar70 << 2;
            *(undefined4 *)(local_580 + uVar74) = 0;
            uVar71 = *(uint *)(local_1c0 + uVar74);
            uVar74 = *(uint *)(local_3c0 + uVar74);
            fVar181 = auVar7._0_4_;
            if ((float)local_aa0._0_4_ < 0.0) {
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar270 = ZEXT1664(auVar270._0_16_);
              fVar181 = sqrtf((float)local_aa0._0_4_);
            }
            auVar226 = ZEXT464(uVar74);
            auVar85 = vminps_avx(auVar11,auVar86);
            auVar236 = vmaxps_avx(auVar11,auVar86);
            auVar210 = ZEXT1664(auVar10);
            auVar89 = vminps_avx(auVar9,auVar10);
            auVar122 = vminps_avx(auVar85,auVar89);
            auVar85 = vmaxps_avx(auVar9,auVar10);
            auVar89 = vmaxps_avx(auVar236,auVar85);
            auVar236 = vandps_avx(auVar122,auVar228);
            auVar85 = vandps_avx(auVar89,auVar228);
            auVar236 = vmaxps_avx(auVar236,auVar85);
            auVar85 = vmovshdup_avx(auVar236);
            auVar85 = vmaxss_avx(auVar85,auVar236);
            auVar236 = vshufpd_avx(auVar236,auVar236,1);
            auVar236 = vmaxss_avx(auVar236,auVar85);
            local_b80._0_4_ = auVar236._0_4_ * 1.9073486e-06;
            local_8c0._0_4_ = fVar181 * 1.9073486e-06;
            local_940._0_16_ = vshufps_avx(auVar89,auVar89,0xff);
            auVar236 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar71),0x10);
            auVar243 = ZEXT1664(auVar236);
            lVar73 = 5;
            do {
              do {
                auVar236 = auVar243._0_16_;
                bVar79 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                if (bVar79) goto LAB_011b7b6d;
                local_b40._0_16_ = vmovshdup_avx(auVar236);
                fVar246 = local_b40._0_4_;
                fVar82 = 1.0 - fVar246;
                fVar198 = fVar82 * fVar82 * fVar82;
                fVar197 = fVar246 * fVar246 * fVar246;
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar198),
                                          ZEXT416((uint)fVar197));
                fVar181 = fVar246 * fVar82;
                auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar181 * 6.0)),
                                           ZEXT416((uint)(fVar82 * fVar181)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * fVar181 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar246 * fVar181)));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar197),
                                          ZEXT416((uint)fVar198));
                fVar196 = (auVar85._0_4_ + auVar84._0_4_) * 0.16666667;
                fVar197 = fVar197 * 0.16666667;
                auVar126._0_4_ = fVar197 * fVar114;
                auVar126._4_4_ = fVar197 * fStack_bec;
                auVar126._8_4_ = fVar197 * fStack_be8;
                auVar126._12_4_ = fVar197 * fStack_be4;
                auVar166._4_4_ = fVar196;
                auVar166._0_4_ = fVar196;
                auVar166._8_4_ = fVar196;
                auVar166._12_4_ = fVar196;
                auVar85 = vfmadd132ps_fma(auVar166,auVar126,auVar9);
                fVar196 = (auVar89._0_4_ + auVar122._0_4_) * 0.16666667;
                auVar127._4_4_ = fVar196;
                auVar127._0_4_ = fVar196;
                auVar127._8_4_ = fVar196;
                auVar127._12_4_ = fVar196;
                auVar85 = vfmadd132ps_fma(auVar127,auVar85,auVar86);
                fVar197 = auVar243._0_4_;
                auVar145._4_4_ = fVar197;
                auVar145._0_4_ = fVar197;
                auVar145._8_4_ = fVar197;
                auVar145._12_4_ = fVar197;
                auVar89 = vfmadd213ps_fma(auVar145,local_a90,_DAT_01f45a50);
                fVar198 = fVar198 * 0.16666667;
                auVar93._4_4_ = fVar198;
                auVar93._0_4_ = fVar198;
                auVar93._8_4_ = fVar198;
                auVar93._12_4_ = fVar198;
                auVar85 = vfmadd132ps_fma(auVar93,auVar85,auVar11);
                local_8a0._0_16_ = auVar85;
                auVar85 = vsubps_avx(auVar89,auVar85);
                _local_b20 = auVar85;
                auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
                fVar196 = auVar85._0_4_;
                if (fVar196 < 0.0) {
                  local_b60._0_16_ = ZEXT416((uint)fVar82);
                  auVar137._0_4_ = sqrtf(fVar196);
                  auVar137._4_60_ = extraout_var_00;
                  auVar89 = auVar137._0_16_;
                  auVar122 = local_b60._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar85,auVar85);
                  auVar122 = ZEXT416((uint)fVar82);
                }
                fVar198 = auVar122._0_4_;
                auVar94._4_4_ = fVar198;
                auVar94._0_4_ = fVar198;
                auVar94._8_4_ = fVar198;
                auVar94._12_4_ = fVar198;
                auVar123 = vfnmsub213ss_fma(local_b40._0_16_,local_b40._0_16_,
                                            ZEXT416((uint)(fVar181 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * 4.0)),auVar122,auVar122);
                fVar181 = fVar198 * -fVar198 * 0.5;
                fVar198 = auVar123._0_4_ * 0.5;
                fVar82 = auVar84._0_4_ * 0.5;
                fVar246 = fVar246 * fVar246 * 0.5;
                auVar205._0_4_ = fVar114 * fVar246;
                auVar205._4_4_ = fStack_bec * fVar246;
                auVar205._8_4_ = fStack_be8 * fVar246;
                auVar205._12_4_ = fStack_be4 * fVar246;
                auVar167._4_4_ = fVar82;
                auVar167._0_4_ = fVar82;
                auVar167._8_4_ = fVar82;
                auVar167._12_4_ = fVar82;
                auVar84 = vfmadd213ps_fma(auVar167,auVar9,auVar205);
                auVar187._4_4_ = fVar198;
                auVar187._0_4_ = fVar198;
                auVar187._8_4_ = fVar198;
                auVar187._12_4_ = fVar198;
                auVar84 = vfmadd213ps_fma(auVar187,auVar86,auVar84);
                auVar259._4_4_ = fVar181;
                auVar259._0_4_ = fVar181;
                auVar259._8_4_ = fVar181;
                auVar259._12_4_ = fVar181;
                auVar158 = vfmadd213ps_fma(auVar259,auVar11,auVar84);
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar122,local_b40._0_16_);
                auVar123 = vfmadd213ss_fma(local_b40._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar122)
                ;
                auVar122 = vshufps_avx(auVar236,auVar236,0x55);
                auVar168._0_4_ = fVar114 * auVar122._0_4_;
                auVar168._4_4_ = fStack_bec * auVar122._4_4_;
                auVar168._8_4_ = fStack_be8 * auVar122._8_4_;
                auVar168._12_4_ = fStack_be4 * auVar122._12_4_;
                uVar77 = auVar123._0_4_;
                auVar188._4_4_ = uVar77;
                auVar188._0_4_ = uVar77;
                auVar188._8_4_ = uVar77;
                auVar188._12_4_ = uVar77;
                auVar122 = vfmadd213ps_fma(auVar188,auVar9,auVar168);
                auVar146._0_4_ = auVar84._0_4_;
                auVar146._4_4_ = auVar146._0_4_;
                auVar146._8_4_ = auVar146._0_4_;
                auVar146._12_4_ = auVar146._0_4_;
                auVar122 = vfmadd213ps_fma(auVar146,auVar86,auVar122);
                auVar142 = vfmadd231ps_fma(auVar122,auVar11,auVar94);
                auVar84 = vdpps_avx(auVar158,auVar158,0x7f);
                auVar122 = vblendps_avx(auVar84,_DAT_01f45a50,0xe);
                auVar123 = vrsqrtss_avx(auVar122,auVar122);
                fVar181 = auVar123._0_4_;
                fVar82 = auVar84._0_4_;
                fVar181 = fVar181 * 1.5 + fVar82 * -0.5 * fVar181 * fVar181 * fVar181;
                auVar123 = vdpps_avx(auVar158,auVar142,0x7f);
                auVar147._0_4_ = auVar142._0_4_ * fVar82;
                auVar147._4_4_ = auVar142._4_4_ * fVar82;
                auVar147._8_4_ = auVar142._8_4_ * fVar82;
                auVar147._12_4_ = auVar142._12_4_ * fVar82;
                fVar198 = auVar123._0_4_;
                auVar206._0_4_ = auVar158._0_4_ * fVar198;
                auVar206._4_4_ = auVar158._4_4_ * fVar198;
                fVar246 = auVar158._8_4_;
                auVar206._8_4_ = fVar246 * fVar198;
                fVar180 = auVar158._12_4_;
                auVar206._12_4_ = fVar180 * fVar198;
                auVar123 = vsubps_avx(auVar147,auVar206);
                auVar122 = vrcpss_avx(auVar122,auVar122);
                auVar142 = vfnmadd213ss_fma(auVar122,auVar84,ZEXT416(0x40000000));
                fVar198 = auVar122._0_4_ * auVar142._0_4_;
                auVar122 = vmaxss_avx(ZEXT416((uint)local_b80._0_4_),
                                      ZEXT416((uint)(fVar197 * (float)local_8c0._0_4_)));
                auVar137 = ZEXT1664(auVar122);
                auVar221._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
                auVar221._8_4_ = -fVar246;
                auVar221._12_4_ = -fVar180;
                auVar169._0_4_ = fVar181 * auVar123._0_4_ * fVar198;
                auVar169._4_4_ = fVar181 * auVar123._4_4_ * fVar198;
                auVar169._8_4_ = fVar181 * auVar123._8_4_ * fVar198;
                auVar169._12_4_ = fVar181 * auVar123._12_4_ * fVar198;
                auVar238._0_4_ = auVar158._0_4_ * fVar181;
                auVar238._4_4_ = auVar158._4_4_ * fVar181;
                auVar238._8_4_ = fVar246 * fVar181;
                auVar238._12_4_ = fVar180 * fVar181;
                local_b40._0_16_ = auVar158;
                local_b60._0_4_ = auVar122._0_4_;
                if (fVar82 < -fVar82) {
                  local_ac0._0_16_ = auVar238;
                  local_ae0._0_16_ = auVar169;
                  fVar181 = sqrtf(fVar82);
                  auVar137 = ZEXT464((uint)local_b60._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar169 = local_ae0._0_16_;
                  auVar238 = local_ac0._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar84,auVar84);
                  fVar181 = auVar122._0_4_;
                }
                auVar122 = vdpps_avx(_local_b20,auVar238,0x7f);
                auVar142 = vfmadd213ss_fma(ZEXT416((uint)local_b80._0_4_),auVar89,auVar137._0_16_);
                auVar84 = vdpps_avx(auVar221,auVar238,0x7f);
                auVar123 = vdpps_avx(_local_b20,auVar169,0x7f);
                auVar158 = vdpps_avx(local_a90,auVar238,0x7f);
                auVar142 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_b80._0_4_ / fVar181)),
                                           auVar142);
                auVar267 = ZEXT1664(auVar142);
                fVar181 = auVar84._0_4_ + auVar123._0_4_;
                auVar270 = ZEXT464((uint)fVar181);
                fVar198 = auVar122._0_4_;
                auVar95._0_4_ = fVar198 * fVar198;
                auVar95._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                auVar95._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                auVar95._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                auVar89 = vdpps_avx(_local_b20,auVar221,0x7f);
                auVar123 = vsubps_avx(auVar85,auVar95);
                auVar84 = vrsqrtss_avx(auVar123,auVar123);
                fVar82 = auVar123._0_4_;
                fVar197 = auVar84._0_4_;
                fVar197 = fVar197 * 1.5 + fVar82 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar84 = vdpps_avx(_local_b20,local_a90,0x7f);
                auVar89 = vfnmadd231ss_fma(auVar89,auVar122,ZEXT416((uint)fVar181));
                auVar84 = vfnmadd231ss_fma(auVar84,auVar122,auVar158);
                if (fVar82 < 0.0) {
                  local_ac0._0_16_ = ZEXT416((uint)fVar181);
                  local_ae0._0_16_ = auVar158;
                  local_8e0._0_16_ = auVar89;
                  local_900._0_4_ = fVar197;
                  local_920._0_16_ = auVar84;
                  fVar181 = sqrtf(fVar82);
                  auVar270 = ZEXT1664(local_ac0._0_16_);
                  auVar267 = ZEXT464(auVar142._0_4_);
                  auVar137 = ZEXT464((uint)local_b60._0_4_);
                  fVar197 = (float)local_900._0_4_;
                  auVar84 = local_920._0_16_;
                  auVar158 = local_ae0._0_16_;
                  auVar89 = local_8e0._0_16_;
                }
                else {
                  auVar123 = vsqrtss_avx(auVar123,auVar123);
                  fVar181 = auVar123._0_4_;
                }
                auVar226 = ZEXT1664(local_b40._0_16_);
                auVar123 = vpermilps_avx(local_8a0._0_16_,0xff);
                fVar181 = fVar181 - auVar123._0_4_;
                auVar123 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xff);
                auVar89 = vfmsub213ss_fma(auVar89,ZEXT416((uint)fVar197),auVar123);
                auVar170._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
                auVar170._8_4_ = auVar158._8_4_ ^ 0x80000000;
                auVar170._12_4_ = auVar158._12_4_ ^ 0x80000000;
                auVar189._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar189._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar189._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar142 = ZEXT416((uint)(auVar84._0_4_ * fVar197));
                auVar83 = auVar270._0_16_;
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar158._0_4_ * auVar89._0_4_)),auVar83,
                                          auVar142);
                auVar210 = ZEXT1664(auVar84);
                auVar89 = vinsertps_avx(auVar189,auVar142,0x1c);
                uVar77 = auVar84._0_4_;
                auVar190._4_4_ = uVar77;
                auVar190._0_4_ = uVar77;
                auVar190._8_4_ = uVar77;
                auVar190._12_4_ = uVar77;
                auVar89 = vdivps_avx(auVar89,auVar190);
                auVar84 = vinsertps_avx(auVar83,auVar170,0x10);
                auVar84 = vdivps_avx(auVar84,auVar190);
                auVar148._0_4_ = fVar198 * auVar89._0_4_ + fVar181 * auVar84._0_4_;
                auVar148._4_4_ = fVar198 * auVar89._4_4_ + fVar181 * auVar84._4_4_;
                auVar148._8_4_ = fVar198 * auVar89._8_4_ + fVar181 * auVar84._8_4_;
                auVar148._12_4_ = fVar198 * auVar89._12_4_ + fVar181 * auVar84._12_4_;
                auVar89 = vsubps_avx(auVar236,auVar148);
                auVar243 = ZEXT1664(auVar89);
                auVar236 = vandps_avx(auVar122,auVar228);
              } while (auVar267._0_4_ <= auVar236._0_4_);
              auVar122 = vfmadd231ss_fma(ZEXT416((uint)(auVar137._0_4_ + auVar267._0_4_)),
                                         local_940._0_16_,ZEXT416(0x36000000));
              auVar236 = vandps_avx(ZEXT416((uint)fVar181),auVar228);
            } while (auVar122._0_4_ <= auVar236._0_4_);
            fVar181 = auVar89._0_4_ + (float)local_a20._0_4_;
            if ((fVar80 <= fVar181) &&
               (fVar197 = *(float *)(ray + k * 4 + 0x100), fVar181 <= fVar197)) {
              auVar236 = vmovshdup_avx(auVar89);
              fVar198 = auVar236._0_4_;
              if ((0.0 <= fVar198) && (fVar198 <= 1.0)) {
                auVar85 = vrsqrtss_avx(auVar85,auVar85);
                fVar82 = auVar85._0_4_;
                auVar210 = ZEXT464((uint)(fVar196 * -0.5));
                pGVar3 = (context->scene->geometries).items[uVar72].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar196 = fVar82 * 1.5 + fVar196 * -0.5 * fVar82 * fVar82 * fVar82;
                  auVar171._0_4_ = fVar196 * (float)local_b20._0_4_;
                  auVar171._4_4_ = fVar196 * (float)local_b20._4_4_;
                  auVar171._8_4_ = fVar196 * fStack_b18;
                  auVar171._12_4_ = fVar196 * fStack_b14;
                  auVar123 = vfmadd213ps_fma(auVar123,auVar171,local_b40._0_16_);
                  auVar85 = vshufps_avx(auVar171,auVar171,0xc9);
                  auVar122 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xc9);
                  auVar172._0_4_ = auVar171._0_4_ * auVar122._0_4_;
                  auVar172._4_4_ = auVar171._4_4_ * auVar122._4_4_;
                  auVar172._8_4_ = auVar171._8_4_ * auVar122._8_4_;
                  auVar172._12_4_ = auVar171._12_4_ * auVar122._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar172,local_b40._0_16_,auVar85);
                  auVar85 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar122 = vshufps_avx(auVar123,auVar123,0xc9);
                  auVar210 = ZEXT1664(auVar122);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar96._0_4_ = auVar123._0_4_ * auVar84._0_4_;
                  auVar96._4_4_ = auVar123._4_4_ * auVar84._4_4_;
                  auVar96._8_4_ = auVar123._8_4_ * auVar84._8_4_;
                  auVar96._12_4_ = auVar123._12_4_ * auVar84._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar96,auVar85,auVar122);
                  uVar77 = auVar85._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar181;
                    uVar2 = vextractps_avx(auVar85,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar2;
                    uVar2 = vextractps_avx(auVar85,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar77;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar198;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_a00;
                    *(uint *)(ray + k * 4 + 0x240) = uVar72;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar5 = context->user;
                    local_4a0 = auVar236._0_8_;
                    auVar236 = vmovshdup_avx(auVar85);
                    local_500._8_8_ = auVar236._0_8_;
                    auVar236 = vshufps_avx(auVar85,auVar85,0xaa);
                    local_4e0 = auVar236._0_8_;
                    local_500._0_8_ = local_500._8_8_;
                    local_500._16_8_ = local_500._8_8_;
                    local_500._24_8_ = local_500._8_8_;
                    uStack_4d8 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4c8 = local_4e0;
                    local_4c0 = uVar77;
                    uStack_4bc = uVar77;
                    uStack_4b8 = uVar77;
                    uStack_4b4 = uVar77;
                    uStack_4b0 = uVar77;
                    uStack_4ac = uVar77;
                    uStack_4a8 = uVar77;
                    uStack_4a4 = uVar77;
                    uStack_498 = local_4a0;
                    uStack_490 = local_4a0;
                    uStack_488 = local_4a0;
                    auVar149._12_4_ = 0;
                    auVar149._0_12_ = ZEXT812(0);
                    auVar149 = auVar149 << 0x20;
                    local_480 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_460 = CONCAT44(uStack_75c,local_760);
                    uStack_458 = CONCAT44(uStack_754,uStack_758);
                    uStack_450 = CONCAT44(uStack_74c,uStack_750);
                    uStack_448 = CONCAT44(uStack_744,uStack_748);
                    local_440._4_4_ = uStack_73c;
                    local_440._0_4_ = local_740;
                    local_440._8_4_ = uStack_738;
                    local_440._12_4_ = uStack_734;
                    local_440._16_4_ = uStack_730;
                    local_440._20_4_ = uStack_72c;
                    local_440._24_4_ = uStack_728;
                    local_440._28_4_ = uStack_724;
                    auVar98 = vpcmpeqd_avx2(local_440,local_440);
                    local_ae8[1] = auVar98;
                    *local_ae8 = auVar98;
                    local_420 = pRVar5->instID[0];
                    uStack_41c = local_420;
                    uStack_418 = local_420;
                    uStack_414 = local_420;
                    uStack_410 = local_420;
                    uStack_40c = local_420;
                    uStack_408 = local_420;
                    uStack_404 = local_420;
                    local_400 = pRVar5->instPrimID[0];
                    uStack_3fc = local_400;
                    uStack_3f8 = local_400;
                    uStack_3f4 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3ec = local_400;
                    uStack_3e8 = local_400;
                    uStack_3e4 = local_400;
                    *(float *)(ray + k * 4 + 0x100) = fVar181;
                    local_a40 = local_780;
                    local_bb0.valid = (int *)local_a40;
                    local_bb0.geometryUserPtr = pGVar3->userPtr;
                    local_bb0.context = context->user;
                    local_bb0.hit = (RTCHitN *)local_500;
                    local_bb0.N = 8;
                    local_bb0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar210 = ZEXT1664(auVar122);
                      auVar226 = ZEXT1664(local_b40._0_16_);
                      auVar243 = ZEXT1664(auVar89);
                      auVar267 = ZEXT1664(auVar267._0_16_);
                      auVar270 = ZEXT1664(auVar83);
                      (*pGVar3->intersectionFilterN)(&local_bb0);
                      auVar149 = ZEXT816(0) << 0x40;
                    }
                    auVar128 = ZEXT1632(auVar149);
                    auVar98 = vpcmpeqd_avx2(local_a40,auVar128);
                    auVar98 = _DAT_01f7b020 & ~auVar98;
                    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0x7f,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar98 >> 0xbf,0) != '\0') ||
                        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar98[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        auVar226 = ZEXT1664(auVar226._0_16_);
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar270 = ZEXT1664(auVar270._0_16_);
                        (*p_Var4)(&local_bb0);
                        auVar128 = ZEXT832(0) << 0x40;
                      }
                      auVar128 = vpcmpeqd_avx2(local_a40,auVar128);
                      auVar98 = _DAT_01f7b020 & ~auVar128;
                      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar98 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar98 >> 0x7f,0) != '\0') ||
                            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0xbf,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar98[0x1f] < '\0') {
                        auVar111._0_8_ = auVar128._0_8_ ^ 0xffffffffffffffff;
                        auVar111._8_4_ = auVar128._8_4_ ^ 0xffffffff;
                        auVar111._12_4_ = auVar128._12_4_ ^ 0xffffffff;
                        auVar111._16_4_ = auVar128._16_4_ ^ 0xffffffff;
                        auVar111._20_4_ = auVar128._20_4_ ^ 0xffffffff;
                        auVar111._24_4_ = auVar128._24_4_ ^ 0xffffffff;
                        auVar111._28_4_ = auVar128._28_4_ ^ 0xffffffff;
                        auVar98 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])local_bb0.hit);
                        *(undefined1 (*) [32])(local_bb0.ray + 0x180) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1a0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1c0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x1e0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                           (local_bb0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x200) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar111,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x220) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar111,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x240) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar111,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x260) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar111,*(undefined1 (*) [32])
                                                            (local_bb0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bb0.ray + 0x280) = auVar98;
                        goto LAB_011b7b6d;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar197;
                  }
                }
              }
            }
LAB_011b7b6d:
            uVar77 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar261._4_4_ = uVar77;
            auVar261._0_4_ = uVar77;
            auVar261._8_4_ = uVar77;
            auVar261._12_4_ = uVar77;
            auVar261._16_4_ = uVar77;
            auVar261._20_4_ = uVar77;
            auVar261._24_4_ = uVar77;
            auVar261._28_4_ = uVar77;
            auVar137 = ZEXT3264(auVar261);
            auVar98 = vcmpps_avx(_local_9a0,auVar261,2);
            local_580 = vandps_avx(auVar98,local_580);
          }
          auVar136._0_4_ = local_a60._0_4_ + local_540._0_4_;
          auVar136._4_4_ = local_a60._4_4_ + local_540._4_4_;
          auVar136._8_4_ = local_a60._8_4_ + local_540._8_4_;
          auVar136._12_4_ = local_a60._12_4_ + local_540._12_4_;
          auVar136._16_4_ = local_a60._16_4_ + local_540._16_4_;
          auVar136._20_4_ = local_a60._20_4_ + local_540._20_4_;
          auVar136._24_4_ = local_a60._24_4_ + local_540._24_4_;
          auVar136._28_4_ = local_a60._28_4_ + local_540._28_4_;
          uVar77 = auVar137._0_4_;
          auVar179._4_4_ = uVar77;
          auVar179._0_4_ = uVar77;
          auVar179._8_4_ = uVar77;
          auVar179._12_4_ = uVar77;
          auVar179._16_4_ = uVar77;
          auVar179._20_4_ = uVar77;
          auVar179._24_4_ = uVar77;
          auVar179._28_4_ = uVar77;
          auVar262 = ZEXT3264(_local_a60);
          auVar128 = vcmpps_avx(auVar136,auVar179,2);
          auVar98 = vandps_avx(local_7e0,local_7c0);
          auVar98 = vandps_avx(auVar128,auVar98);
          auVar195._0_4_ = local_a60._0_4_ + local_3e0._0_4_;
          auVar195._4_4_ = local_a60._4_4_ + local_3e0._4_4_;
          auVar195._8_4_ = local_a60._8_4_ + local_3e0._8_4_;
          auVar195._12_4_ = local_a60._12_4_ + local_3e0._12_4_;
          auVar195._16_4_ = local_a60._16_4_ + local_3e0._16_4_;
          auVar195._20_4_ = local_a60._20_4_ + local_3e0._20_4_;
          auVar195._24_4_ = local_a60._24_4_ + local_3e0._24_4_;
          auVar195._28_4_ = local_a60._28_4_ + local_3e0._28_4_;
          auVar8 = vcmpps_avx(auVar195,auVar179,2);
          auVar128 = vandps_avx(_local_9e0,local_9c0);
          auVar128 = vandps_avx(auVar8,auVar128);
          auVar128 = vorps_avx(auVar98,auVar128);
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0x7f,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0xbf,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar128[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar75 * 0x60) = auVar128;
            auVar98 = vblendvps_avx(_local_3e0,local_540,auVar98);
            *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar98;
            uVar76 = vmovlps_avx(local_790);
            (&uStack_140)[uVar75 * 0xc] = uVar76;
            aiStack_138[uVar75 * 0x18] = local_cc4 + 1;
            uVar75 = (ulong)((int)uVar75 + 1);
          }
          goto LAB_011b6627;
        }
      }
      auVar267 = ZEXT3264(auVar265);
      auVar243 = ZEXT3264(_local_9a0);
      auVar226 = ZEXT3264(local_9c0);
      auVar262 = ZEXT3264(_local_a60);
    }
LAB_011b6627:
    while( true ) {
      uVar71 = (uint)uVar75;
      if (uVar71 == 0) {
        uVar77 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar97._4_4_ = uVar77;
        auVar97._0_4_ = uVar77;
        auVar97._8_4_ = uVar77;
        auVar97._12_4_ = uVar77;
        auVar6 = vcmpps_avx(local_7a0,auVar97,2);
        uVar72 = vmovmskps_avx(auVar6);
        uVar78 = (ulong)((uint)uVar78 & uVar72);
        goto LAB_011b567b;
      }
      uVar75 = (ulong)(uVar71 - 1);
      lVar73 = uVar75 * 0x60;
      auVar98 = *(undefined1 (*) [32])(auStack_160 + lVar73);
      auVar106._0_4_ = auVar262._0_4_ + auVar98._0_4_;
      auVar106._4_4_ = auVar262._4_4_ + auVar98._4_4_;
      auVar106._8_4_ = auVar262._8_4_ + auVar98._8_4_;
      auVar106._12_4_ = auVar262._12_4_ + auVar98._12_4_;
      auVar106._16_4_ = auVar262._16_4_ + auVar98._16_4_;
      auVar106._20_4_ = auVar262._20_4_ + auVar98._20_4_;
      auVar106._24_4_ = auVar262._24_4_ + auVar98._24_4_;
      auVar106._28_4_ = auVar262._28_4_ + auVar98._28_4_;
      uVar77 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar177._4_4_ = uVar77;
      auVar177._0_4_ = uVar77;
      auVar177._8_4_ = uVar77;
      auVar177._12_4_ = uVar77;
      auVar177._16_4_ = uVar77;
      auVar177._20_4_ = uVar77;
      auVar177._24_4_ = uVar77;
      auVar177._28_4_ = uVar77;
      auVar8 = vcmpps_avx(auVar106,auVar177,2);
      auVar128 = vandps_avx(auVar8,*(undefined1 (*) [32])(auStack_180 + lVar73));
      local_500 = auVar128;
      auVar8 = *(undefined1 (*) [32])(auStack_180 + lVar73) & auVar8;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      break;
      uVar75 = (ulong)(uVar71 - 1);
    }
    auVar152._8_4_ = 0x7f800000;
    auVar152._0_8_ = 0x7f8000007f800000;
    auVar152._12_4_ = 0x7f800000;
    auVar152._16_4_ = 0x7f800000;
    auVar152._20_4_ = 0x7f800000;
    auVar152._24_4_ = 0x7f800000;
    auVar152._28_4_ = 0x7f800000;
    auVar98 = vblendvps_avx(auVar152,auVar98,auVar128);
    auVar8 = vshufps_avx(auVar98,auVar98,0xb1);
    auVar8 = vminps_avx(auVar98,auVar8);
    auVar12 = vshufpd_avx(auVar8,auVar8,5);
    auVar8 = vminps_avx(auVar8,auVar12);
    auVar12 = vpermpd_avx2(auVar8,0x4e);
    auVar8 = vminps_avx(auVar8,auVar12);
    auVar98 = vcmpps_avx(auVar98,auVar8,0);
    auVar8 = auVar128 & auVar98;
    if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0x7f,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar8 >> 0xbf,0) != '\0') ||
        (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0') {
      auVar128 = vandps_avx(auVar98,auVar128);
    }
    uVar74 = vmovmskps_avx(auVar128);
    iVar70 = 0;
    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
      iVar70 = iVar70 + 1;
    }
    *(undefined4 *)(local_500 + (uint)(iVar70 << 2)) = 0;
    uVar76 = (&uStack_140)[uVar75 * 0xc];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar76;
    local_cc4 = aiStack_138[uVar75 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar73) = local_500;
    uVar74 = uVar71 - 1;
    if ((((((((local_500 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_500 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_500 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_500 >> 0x7f,0) != '\0') ||
          (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_500 >> 0xbf,0) != '\0') ||
        (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_500[0x1f] < '\0') {
      uVar74 = uVar71;
    }
    uVar77 = (undefined4)uVar76;
    auVar130._4_4_ = uVar77;
    auVar130._0_4_ = uVar77;
    auVar130._8_4_ = uVar77;
    auVar130._12_4_ = uVar77;
    auVar130._16_4_ = uVar77;
    auVar130._20_4_ = uVar77;
    auVar130._24_4_ = uVar77;
    auVar130._28_4_ = uVar77;
    auVar236 = vmovshdup_avx(auVar87);
    auVar236 = vsubps_avx(auVar236,auVar87);
    auVar107._0_4_ = auVar236._0_4_;
    auVar107._4_4_ = auVar107._0_4_;
    auVar107._8_4_ = auVar107._0_4_;
    auVar107._12_4_ = auVar107._0_4_;
    auVar107._16_4_ = auVar107._0_4_;
    auVar107._20_4_ = auVar107._0_4_;
    auVar107._24_4_ = auVar107._0_4_;
    auVar107._28_4_ = auVar107._0_4_;
    auVar236 = vfmadd132ps_fma(auVar107,auVar130,_DAT_01f7b040);
    local_540 = ZEXT1632(auVar236);
    auVar137 = ZEXT864(*(ulong *)(local_540 + (uint)(iVar70 << 2)));
    uVar75 = (ulong)uVar74;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }